

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O1

spv_result_t spvtools::val::ValidateDecorations(ValidationState_t *vstate)

{
  _Tuple_impl<0UL,_spv::Decoration,_unsigned_int> *p_Var1;
  bool bVar2;
  uint16_t uVar3;
  ushort uVar4;
  uint16_t uVar5;
  MatrixLayout id;
  MatrixLayout id_00;
  uint uVar6;
  _Head_base<0UL,_spv::Decoration,_false> id_01;
  _Head_base<1UL,_unsigned_int,_false> _Var7;
  _Rb_tree_color _Var8;
  MatrixLayout *pMVar9;
  pointer psVar10;
  pointer psVar11;
  __node_base_ptr p_Var12;
  pointer pIVar13;
  pointer puVar14;
  _Hash_node_base *p_Var15;
  pointer pFVar16;
  __node_base _Var17;
  __hashtable *p_Var18;
  __hashtable *p_Var19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  StorageClass SVar23;
  undefined4 uVar24;
  MatrixLayout MVar25;
  uint uVar26;
  MatrixLayout MVar27;
  spv_result_t sVar28;
  uint32_t uVar29;
  Op OVar30;
  uint32_t uVar31;
  MemoryModel MVar32;
  ValidationState_t *pVVar33;
  mapped_type *pmVar34;
  _Base_ptr extraout_RAX;
  MatrixLayout *pMVar35;
  _Node_iterator_base<spv::BuiltIn,_false> _Var36;
  undefined7 extraout_var;
  _Rb_tree_node_base *extraout_RAX_00;
  _Rb_tree_node_base *extraout_RAX_01;
  undefined7 extraout_var_00;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *psVar37;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined8 extraout_RAX_02;
  mapped_type *pmVar38;
  Instruction *pIVar39;
  __hashtable *p_Var40;
  _Rb_tree_node_base *p_Var41;
  MatrixLayout *pMVar42;
  Instruction *pIVar43;
  DiagnosticStream *pDVar44;
  iterator iVar45;
  iterator iVar46;
  vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_> *pvVar47;
  size_t sVar48;
  __node_base *p_Var49;
  ostream *poVar50;
  _Base_ptr p_Var51;
  float fVar52;
  uint uVar53;
  ValidationState_t *in_RCX;
  _Tuple_impl<0UL,_spv::Decoration,_unsigned_int> _Var54;
  _Base_ptr p_Var55;
  _Base_ptr p_Var56;
  Decoration decoration;
  int iVar57;
  uint extraout_EDX;
  size_t sVar58;
  long lVar59;
  char *decoration_str;
  Function *function;
  __node_base_ptr p_Var60;
  __hashtable *p_Var61;
  anon_unknown_0 *this;
  pointer this_00;
  byte bVar62;
  _Rb_tree_header *p_Var63;
  char *pcVar64;
  ulong uVar65;
  pointer pIVar66;
  uint32_t pair_idx;
  pointer pEVar67;
  uint32_t decoration_00;
  MatrixLayout *pMVar68;
  bool bVar69;
  bool bVar70;
  char cVar71;
  pair<std::__detail::_Node_iterator<spvtools::val::Instruction_*,_true,_false>,_bool> pVar72;
  pair<std::__detail::_Node_iterator<spv::BuiltIn,_true,_false>,_bool> pVar73;
  pair<std::_Rb_tree_iterator<std::tuple<spv::Decoration,_unsigned_int>_>,_bool> pVar74;
  pair<std::_Rb_tree_iterator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_bool>
  pVar75;
  ulong local_638;
  spv_result_t local_61c;
  string linkage_name;
  byte local_5f8;
  _Base_ptr local_5e8;
  uint local_5cc;
  unordered_set<spv::BuiltIn,_std::hash<spv::BuiltIn>,_std::equal_to<spv::BuiltIn>,_std::allocator<spv::BuiltIn>_>
  output_var_builtin;
  __hashtable *__h_3;
  int local_57c;
  PerIDKey k;
  undefined8 uStack_570;
  undefined1 local_568 [24];
  __hashtable *__h_1;
  __hashtable *__h;
  undefined8 local_540;
  uint ep_id;
  undefined4 uStack_534;
  int local_52c;
  Instruction *var_instr;
  uint32_t uStack_520;
  undefined4 uStack_51c;
  code *local_518;
  code *local_510;
  _Base_ptr local_508;
  pointer local_500;
  undefined8 local_4f8;
  int local_4ec;
  EnumSet<spv::Capability> *local_4e8;
  _Base_ptr local_4e0;
  __hashtable *__h_2;
  pointer local_4d0;
  unordered_set<spv::BuiltIn,_std::hash<spv::BuiltIn>,_std::equal_to<spv::BuiltIn>,_std::allocator<spv::BuiltIn>_>
  input_var_builtin;
  BuiltIn builtin;
  undefined4 uStack_484;
  undefined8 uStack_480;
  code *local_478;
  code *local_470;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_468;
  MatrixLayout *local_460;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_458;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_438;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_418;
  undefined1 local_3f8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3f0;
  undefined4 local_3d8;
  spv_result_t local_228;
  int local_220;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_218;
  undefined4 local_200;
  int local_1f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1f0;
  undefined4 local_1d8;
  int local_1d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c8;
  undefined4 local_1b0;
  unordered_set<spvtools::val::Instruction_*,_std::hash<spvtools::val::Instruction_*>,_std::equal_to<spvtools::val::Instruction_*>,_std::allocator<spvtools::val::Instruction_*>_>
  seen_vars;
  ios_base local_138 [264];
  
  local_5e8 = (_Base_ptr)&(vstate->global_vars_)._M_h._M_before_begin;
  do {
    local_5e8 = *(_Base_ptr *)local_5e8;
    if (local_5e8 == (_Base_ptr)0x0) {
      local_61c = SPV_SUCCESS;
      break;
    }
    uVar29 = *(uint32_t *)&local_5e8->_M_parent;
    pVVar33 = (ValidationState_t *)ValidationState_t::FindDef(vstate,uVar29);
    bVar70 = true;
    if (((long)pVVar33->options_ -
         (long)(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pVVar33->context_)->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start == 0x14) &&
       (bVar20 = anon_unknown_0::hasImportLinkageAttribute(uVar29,vstate), bVar20)) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,(Instruction *)pVVar33);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3f8,
                 "A module-scope OpVariable with initialization value cannot be marked with the Import Linkage Type."
                 ,0x62);
      local_61c = local_228;
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
      bVar70 = false;
      in_RCX = pVVar33;
    }
  } while (bVar70);
  if (local_61c == SPV_SUCCESS) {
    pMVar42 = (vstate->entry_points_).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_460 = (vstate->entry_points_).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    decoration = (Decoration)vstate;
    if (pMVar42 != local_460) {
      local_468 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&vstate->entry_point_descriptions_;
      __h = (__hashtable *)&vstate->id_decorations_;
      __h_2 = (__hashtable *)&vstate->grammar_;
      local_4e8 = &vstate->module_capabilities_;
      do {
        MVar27 = *pMVar42;
        local_3f8._0_4_ = MVar27;
        pmVar34 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::at(local_468,(key_type *)local_3f8);
        pEVar67 = (pmVar34->
                  super__Vector_base<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_500 = (pmVar34->
                    super__Vector_base<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        in_RCX = (ValidationState_t *)0x4;
        if (pEVar67 != local_500) {
          local_5cc = 0;
          iVar57 = 0;
          local_52c = 0;
          local_57c = 0;
          local_4ec = 0;
          local_638 = 0;
          do {
            local_4f8 = (ValidationState_t *)CONCAT44(local_4f8._4_4_,iVar57);
            seen_vars._M_h._M_buckets = &seen_vars._M_h._M_single_bucket;
            seen_vars._M_h._M_bucket_count = 1;
            seen_vars._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            seen_vars._M_h._M_element_count = 0;
            seen_vars._M_h._M_rehash_policy._M_max_load_factor = 1.0;
            seen_vars._M_h._M_rehash_policy._M_next_resize = 0;
            seen_vars._M_h._M_single_bucket = (__node_base_ptr)0x0;
            input_var_builtin._M_h._M_buckets = &input_var_builtin._M_h._M_single_bucket;
            input_var_builtin._M_h._M_bucket_count = 1;
            input_var_builtin._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            input_var_builtin._M_h._M_element_count = 0;
            input_var_builtin._M_h._M_rehash_policy._M_max_load_factor = 1.0;
            input_var_builtin._M_h._M_rehash_policy._M_next_resize = 0;
            input_var_builtin._M_h._M_single_bucket = (__node_base_ptr)0x0;
            output_var_builtin._M_h._M_buckets = &output_var_builtin._M_h._M_single_bucket;
            output_var_builtin._M_h._M_bucket_count = 1;
            output_var_builtin._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            output_var_builtin._M_h._M_element_count = 0;
            output_var_builtin._M_h._M_rehash_policy._M_max_load_factor = 1.0;
            output_var_builtin._M_h._M_rehash_policy._M_next_resize = 0;
            output_var_builtin._M_h._M_single_bucket = (__node_base_ptr)0x0;
            pMVar9 = (pEVar67->interfaces).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            local_4d0 = pEVar67;
            for (pMVar68 = (pEVar67->interfaces).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start; pMVar68 != pMVar9;
                pMVar68 = pMVar68 + 1) {
              id = *pMVar68;
              var_instr = ValidationState_t::FindDef(vstate,id);
              if ((var_instr == (Instruction *)0x0) ||
                 ((uVar3 = (var_instr->inst_).opcode, uVar3 != 0x3b && (uVar3 != 0x1142)))) {
                ValidationState_t::diag
                          ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,var_instr);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3f8,
                           "Interfaces passed to OpEntryPoint must be variables. Found Op",0x3d);
                linkage_name._M_dataplus._M_p = spvOpcodeString((uint)(var_instr->inst_).opcode);
                pDVar44 = DiagnosticStream::operator<<
                                    ((DiagnosticStream *)local_3f8,(char **)&linkage_name);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar44,".",1);
                sVar28 = pDVar44->error_;
LAB_0062b9ea:
                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
LAB_0062b9f2:
                local_5e8 = (_Base_ptr)(ulong)(uint)sVar28;
                pVVar33 = (ValidationState_t *)0x1;
              }
              else {
                SVar23 = Instruction::GetOperandAs<spv::StorageClass>(var_instr,2);
                if (SVar23 == StorageClassTaskPayloadWorkgroupEXT && 0x103ff < vstate->version_) {
                  local_5f8 = 1;
                  if ((local_638 & 1) != 0) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,var_instr);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,
                               "There can be at most one OpVariable with storage class TaskPayloadWorkgroupEXT associated with an OpEntryPoint"
                               ,0x6e);
                    sVar28 = local_228;
                    goto LAB_0062b9ea;
                  }
                }
                else {
                  local_5f8 = (byte)local_638;
                }
                if (vstate->version_ < 0x10400) {
                  if ((SVar23 & ~StorageClassUniform) != Input) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,var_instr);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,
                               "OpEntryPoint interfaces must be OpVariables with Storage Class of Input(1) or Output(3). Found Storage Class "
                               ,0x6d);
                    std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8," for Entry Point id ",0x14);
                    std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                    lVar59 = 1;
                    pcVar64 = ".";
                    goto LAB_0062bab7;
                  }
LAB_0062bb1b:
                  puVar14 = (var_instr->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  if (uVar3 == 0x1142) {
                    pMVar35 = puVar14 + 4;
                  }
                  else {
                    pIVar39 = ValidationState_t::FindDef(vstate,puVar14[1]);
                    pMVar35 = (pIVar39->words_).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start + 3;
                  }
                  id_00 = *pMVar35;
                  local_540 = ValidationState_t::FindDef(vstate,id_00);
                  if (local_540 == (Instruction *)0x0) {
                    uVar24 = 0;
                  }
                  else {
                    uVar24 = (undefined4)
                             CONCAT71((int7)((ulong)local_540 >> 8),
                                      (local_540->inst_).opcode == 0x1e);
                  }
                  local_5e8 = (_Base_ptr)((ulong)local_5e8 & 0xffffffff);
                  __h_1 = (__hashtable *)CONCAT44(__h_1._4_4_,uVar24);
                  MVar25 = id;
                  if ((char)uVar24 != '\0') {
                    MVar25 = id_00;
                  }
                  local_3f8._0_4_ = MVar25;
                  _Var36._M_cur =
                       (__node_type *)
                       std::
                       map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                       ::operator[]((map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                                     *)__h,(key_type_conflict *)local_3f8);
                  p_Var63 = (_Rb_tree_header *)&((_Rb_tree_node_base *)_Var36._M_cur)->_M_parent;
                  if ((_Rb_tree_header *)((_Rb_tree_node_base *)_Var36._M_cur)->_M_right == p_Var63)
                  {
                    pVVar33 = (ValidationState_t *)0x8;
                    bVar70 = false;
                  }
                  else {
                    bVar70 = false;
                    p_Var51 = ((_Rb_tree_node_base *)_Var36._M_cur)->_M_right;
                    do {
                      pVVar33 = (ValidationState_t *)0x9;
                      if (p_Var51[1]._M_color == 0xb) {
                        bVar20 = spvIsVulkanEnv(vstate->context_->target_env);
                        _Var36._M_cur = (__node_type *)CONCAT71(extraout_var,bVar20);
                        bVar70 = true;
                        if (bVar20) {
                          if (p_Var51[1]._M_color != 0xb) {
                            __assert_fail("dec_type_ == spv::Decoration::BuiltIn",
                                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/decoration.h"
                                          ,0x4f,
                                          "spv::BuiltIn spvtools::val::Decoration::builtin() const")
                            ;
                          }
                          _Var8 = (p_Var51[1]._M_parent)->_M_color;
                          _Var36._M_cur = (__node_type *)(ulong)_Var8;
                          builtin = _Var8;
                          if (SVar23 == Output) {
                            local_3f8 = (undefined1  [8])&output_var_builtin;
                            pVar73 = std::
                                     _Hashtable<spv::BuiltIn,spv::BuiltIn,std::allocator<spv::BuiltIn>,std::__detail::_Identity,std::equal_to<spv::BuiltIn>,std::hash<spv::BuiltIn>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                     ::
                                     _M_insert<spv::BuiltIn_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spv::BuiltIn,false>>>>
                                               ((_Hashtable<spv::BuiltIn,spv::BuiltIn,std::allocator<spv::BuiltIn>,std::__detail::_Identity,std::equal_to<spv::BuiltIn>,std::hash<spv::BuiltIn>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                                 *)local_3f8,&builtin,local_3f8);
                            _Var36._M_cur =
                                 (__node_type *)
                                 pVar73.first.super__Node_iterator_base<spv::BuiltIn,_false>._M_cur;
                            pVVar33 = (ValidationState_t *)0x0;
                            if (((undefined1  [16])pVar73 & (undefined1  [16])0x1) ==
                                (undefined1  [16])0x0) {
                              ValidationState_t::diag
                                        ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,
                                         var_instr);
                              ValidationState_t::VkErrorID_abi_cxx11_
                                        (&linkage_name,vstate,0x25bb,(char *)0x0);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                                         linkage_name._M_string_length);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_3f8,
                                         "OpEntryPoint contains duplicate output variables with ",
                                         0x36);
                              k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                              super__Tuple_impl<1UL,_unsigned_int>.
                              super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                                   (_Head_base<1UL,_unsigned_int,_false>)0x0;
                              k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                              super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl =
                                   DecorationRelaxedPrecision;
                              sVar28 = AssemblyGrammar::lookupOperand
                                                 ((AssemblyGrammar *)__h_2,SPV_OPERAND_TYPE_BUILT_IN
                                                  ,builtin,(spv_operand_desc *)&k);
                              _Var54 = (_Tuple_impl<0UL,_spv::Decoration,_unsigned_int>)
                                       ((long)"Value Unknown" + 6);
                              if (k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int> !=
                                  (_Tuple_impl<0UL,_spv::Decoration,_unsigned_int>)0x0 &&
                                  sVar28 == SPV_SUCCESS) {
                                _Var54 = *k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>;
                              }
                              k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int> = _Var54;
                              pDVar44 = DiagnosticStream::operator<<
                                                  ((DiagnosticStream *)local_3f8,(char **)&k);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)pDVar44," builtin",8);
                              local_5e8 = (_Base_ptr)(ulong)(uint)pDVar44->error_;
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                                operator_delete(linkage_name._M_dataplus._M_p,
                                                linkage_name.field_2._M_allocated_capacity + 1);
                              }
                              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                              pVVar33 = (ValidationState_t *)0x1;
                              _Var36._M_cur = (__node_type *)extraout_RAX_00;
                            }
                          }
                          else {
                            if (SVar23 == Input) {
                              local_3f8 = (undefined1  [8])&input_var_builtin;
                              pVar73 = std::
                                       _Hashtable<spv::BuiltIn,spv::BuiltIn,std::allocator<spv::BuiltIn>,std::__detail::_Identity,std::equal_to<spv::BuiltIn>,std::hash<spv::BuiltIn>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                       ::
                                       _M_insert<spv::BuiltIn_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spv::BuiltIn,false>>>>
                                                 ((
                                                  _Hashtable<spv::BuiltIn,spv::BuiltIn,std::allocator<spv::BuiltIn>,std::__detail::_Identity,std::equal_to<spv::BuiltIn>,std::hash<spv::BuiltIn>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                                  *)local_3f8,&builtin,(DiagnosticStream *)local_3f8
                                                 );
                              _Var36._M_cur =
                                   (__node_type *)
                                   pVar73.first.super__Node_iterator_base<spv::BuiltIn,_false>.
                                   _M_cur;
                              if (((undefined1  [16])pVar73 & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0) {
                                ValidationState_t::diag
                                          ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID
                                           ,var_instr);
                                ValidationState_t::VkErrorID_abi_cxx11_
                                          (&linkage_name,vstate,0x25ba,(char *)0x0);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                                           linkage_name._M_string_length);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_3f8,
                                           "OpEntryPoint contains duplicate input variables with ",
                                           0x35);
                                k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                                super__Tuple_impl<1UL,_unsigned_int>.
                                super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                                     (_Head_base<1UL,_unsigned_int,_false>)0x0;
                                k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                                super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl =
                                     DecorationRelaxedPrecision;
                                sVar28 = AssemblyGrammar::lookupOperand
                                                   ((AssemblyGrammar *)__h_2,
                                                    SPV_OPERAND_TYPE_BUILT_IN,builtin,
                                                    (spv_operand_desc *)&k);
                                _Var54 = (_Tuple_impl<0UL,_spv::Decoration,_unsigned_int>)
                                         ((long)"Value Unknown" + 6);
                                if (k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int> !=
                                    (_Tuple_impl<0UL,_spv::Decoration,_unsigned_int>)0x0 &&
                                    sVar28 == SPV_SUCCESS) {
                                  _Var54 = *k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>;
                                }
                                k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int> = _Var54;
                                pDVar44 = DiagnosticStream::operator<<
                                                    ((DiagnosticStream *)local_3f8,(char **)&k);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)pDVar44," builtin",8);
                                local_5e8 = (_Base_ptr)(ulong)(uint)pDVar44->error_;
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                                  operator_delete(linkage_name._M_dataplus._M_p,
                                                  linkage_name.field_2._M_allocated_capacity + 1);
                                }
                                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                                pVVar33 = (ValidationState_t *)0x1;
                                _Var36._M_cur = (__node_type *)extraout_RAX_01;
                                goto LAB_0062becc;
                              }
                            }
                            pVVar33 = (ValidationState_t *)0x0;
                          }
                        }
                        else {
                          pVVar33 = (ValidationState_t *)0x9;
                        }
                      }
LAB_0062becc:
                      if (((int)pVVar33 != 9) && ((int)pVVar33 != 0)) goto LAB_0062bef8;
                      _Var36._M_cur = (__node_type *)std::_Rb_tree_increment(p_Var51);
                      p_Var51 = (_Base_ptr)_Var36._M_cur;
                    } while ((_Rb_tree_header *)_Var36._M_cur != p_Var63);
                    pVVar33 = (ValidationState_t *)0x8;
                  }
LAB_0062bef8:
                  if ((int)pVVar33 != 8) {
                    local_638 = CONCAT71((int7)((ulong)_Var36._M_cur >> 8),local_5f8) & 0xffffffff;
                    goto LAB_0062bad8;
                  }
                  if (bVar70) {
                    local_3f8._0_4_ = id;
                    pmVar38 = std::
                              map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                              ::operator[]((map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                                            *)__h,(key_type_conflict *)local_3f8);
                    p_Var51 = (pmVar38->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                    p_Var63 = &(pmVar38->_M_t)._M_impl.super__Rb_tree_header;
                    uVar26 = 0;
                    pMVar35 = pMVar9;
                    if ((_Rb_tree_header *)p_Var51 != p_Var63) {
                      do {
                        bVar20 = spvIsVulkanEnv(vstate->context_->target_env);
                        bVar70 = true;
                        if ((bVar20) && ((p_Var51[1]._M_color & ~_S_black) == 0x1e)) {
                          pIVar39 = ValidationState_t::FindDef(vstate,id);
                          ValidationState_t::diag
                                    ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,
                                     pIVar39);
                          ValidationState_t::VkErrorID_abi_cxx11_
                                    (&linkage_name,vstate,0x1333,(char *)0x0);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                                     linkage_name._M_string_length);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3f8,"A BuiltIn variable (id ",0x17);
                          std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3f8,
                                     ") cannot have any Location or Component decorations",0x33);
                          pMVar35 = (MatrixLayout *)(ulong)(uint)local_228;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                            operator_delete(linkage_name._M_dataplus._M_p,
                                            linkage_name.field_2._M_allocated_capacity + 1);
                          }
                          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                          bVar70 = false;
                        }
                        if (!bVar70) {
                          uVar26 = (uint)pMVar35;
                          goto LAB_0062c14b;
                        }
                        p_Var51 = (_Base_ptr)std::_Rb_tree_increment(p_Var51);
                      } while ((_Rb_tree_header *)p_Var51 != p_Var63);
                      uVar26 = 0;
                    }
LAB_0062c14b:
                    pVVar33 = (ValidationState_t *)0x1;
                    if (uVar26 != 0) {
                      local_5e8._0_4_ = uVar26;
                    }
                    local_5e8 = (_Base_ptr)(ulong)(uint)local_5e8;
                    p_Var51 = local_5e8;
                    if (uVar26 == 0) {
                      if ((char)__h_1 != '\0') {
                        local_3f8._0_4_ = id_00;
                        pmVar38 = std::
                                  map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                                  ::operator[]((map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                                                *)__h,(key_type_conflict *)local_3f8);
                        p_Var63 = &(pmVar38->_M_t)._M_impl.super__Rb_tree_header;
                        for (p_Var41 = (pmVar38->_M_t)._M_impl.super__Rb_tree_header._M_header.
                                       _M_left;
                            ((_Rb_tree_header *)p_Var41 != p_Var63 && (p_Var41[1]._M_color != 2));
                            p_Var41 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var41)) {
                        }
                        if ((_Rb_tree_header *)p_Var41 == p_Var63) {
                          pIVar39 = ValidationState_t::FindDef(vstate,id_00);
                          ValidationState_t::diag
                                    ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_DATA,
                                     pIVar39);
                          ValidationState_t::VkErrorID_abi_cxx11_
                                    (&linkage_name,vstate,0x1337,(char *)0x0);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                                     linkage_name._M_string_length);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3f8,
                                     "Interface struct has no Block decoration but has BuiltIn members. Location decorations must be used on each member of OpVariable with a structure type that is a block not decorated with Location."
                                     ,0xc3);
                          sVar28 = local_228;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                            operator_delete(linkage_name._M_dataplus._M_p,
                                            linkage_name.field_2._M_allocated_capacity + 1);
                          }
                          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                          local_638 = CONCAT71((int7)((ulong)extraout_RAX_02 >> 8),local_5f8) &
                                      0xffffffff;
                          goto LAB_0062b9f2;
                        }
                        local_5cc = local_5cc + (SVar23 == Input);
                        pVVar33 = (ValidationState_t *)(ulong)local_5cc;
                        iVar57 = (int)local_4f8 + (uint)(SVar23 == Output);
                        local_4f8._4_4_ = (undefined4)((ulong)local_4f8 >> 0x20);
                        local_4f8 = (ValidationState_t *)CONCAT44(local_4f8._4_4_,iVar57);
                        if ((1 < (int)local_5cc) || (1 < iVar57)) {
                          local_638 = (ulong)local_5f8;
                          pVVar33 = (ValidationState_t *)0x6;
                          goto LAB_0062bad8;
                        }
                      }
                      goto LAB_0062c0f6;
                    }
                  }
                  else {
LAB_0062c0f6:
                    if ((SVar23 == StorageClassWorkgroup) &&
                       (local_52c = local_52c + 1, local_540 != (Instruction *)0x0)) {
                      if ((local_540->inst_).opcode == 0x1e) {
                        bVar70 = anon_unknown_0::hasDecoration
                                           ((anon_unknown_0 *)(ulong)id_00,2,decoration,pVVar33);
                        if (bVar70) {
                          local_57c = local_57c + 1;
                        }
                        else if ((uVar3 == 0x1142) &&
                                (bVar70 = EnumSet<spv::Capability>::contains
                                                    (local_4e8,CapabilityShader), bVar70)) {
                          ValidationState_t::diag
                                    ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,
                                     var_instr);
                          lVar59 = 0x3e;
                          pcVar64 = "Untyped workgroup variables in shaders must be block decorated"
                          ;
                          goto LAB_0062bab7;
                        }
                        bVar70 = anon_unknown_0::hasDecoration
                                           ((anon_unknown_0 *)(ulong)(var_instr->inst_).result_id,
                                            0x14,decoration,pVVar33);
                        local_4ec = local_4ec + (uint)bVar70;
                        goto LAB_0062c299;
                      }
                      if ((uVar3 != 0x1142) ||
                         (bVar70 = EnumSet<spv::Capability>::contains(local_4e8,CapabilityShader),
                         !bVar70)) goto LAB_0062c299;
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,var_instr
                                );
                      lVar59 = 0x46;
                      pcVar64 = 
                      "Untyped workgroup variables in shaders must be block decorated structs";
LAB_0062bab7:
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3f8,pcVar64,lVar59);
                      local_5e8 = (_Base_ptr)(ulong)(uint)local_228;
                      goto LAB_0062bac4;
                    }
LAB_0062c299:
                    bVar70 = spvIsVulkanEnv(vstate->context_->target_env);
                    pVVar33 = (ValidationState_t *)0x0;
                    p_Var51 = (_Base_ptr)CONCAT71(extraout_var_00,bVar70);
                    if (bVar70) {
                      psVar37 = ValidationState_t::GetExecutionModels(vstate,MVar27);
                      p_Var63 = &(psVar37->_M_t)._M_impl.super__Rb_tree_header;
                      p_Var51 = (psVar37->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
                      p_Var56 = p_Var51;
                      p_Var55 = &p_Var63->_M_header;
                      for (; p_Var56 != (_Base_ptr)0x0; p_Var56 = (&p_Var56->_M_left)[bVar70]) {
                        bVar70 = p_Var56[1]._M_color < 4;
                        if (!bVar70) {
                          p_Var55 = p_Var56;
                        }
                      }
                      p_Var56 = &p_Var63->_M_header;
                      local_508 = &p_Var63->_M_header;
                      if (((_Rb_tree_header *)p_Var55 != p_Var63) &&
                         (local_508 = p_Var55, 4 < p_Var55[1]._M_color)) {
                        local_508 = &p_Var63->_M_header;
                      }
                      for (; p_Var51 != (_Base_ptr)0x0; p_Var51 = p_Var51->_M_left) {
                        p_Var56 = p_Var51;
                      }
                      local_4e0 = &p_Var63->_M_header;
                      if (((_Rb_tree_header *)p_Var56 != p_Var63) &&
                         (local_4e0 = p_Var56, p_Var56[1]._M_color != _S_red)) {
                        local_4e0 = &p_Var63->_M_header;
                      }
                      local_3f8._0_4_ = (var_instr->inst_).result_id;
                      pmVar38 = std::
                                map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                                ::operator[]((map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                                              *)__h,(key_type_conflict *)local_3f8);
                      pIVar39 = (Instruction *)
                                (pmVar38->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                      local_540 = (Instruction *)&(pmVar38->_M_t)._M_impl.super__Rb_tree_header;
                      pVVar33 = (ValidationState_t *)0xa;
                      p_Var51 = (_Base_ptr)
                                CONCAT71((int7)((ulong)local_540 >> 8),pIVar39 == local_540);
                      if (pIVar39 != local_540) {
                        p_Var51 = (_Base_ptr)0x0;
                        do {
                          __h_1 = (__hashtable *)CONCAT44(__h_1._4_4_,(int)p_Var51);
                          linkage_name._M_dataplus._M_p = (pointer)0x0;
                          linkage_name._M_string_length = 0;
                          linkage_name.field_2._M_allocated_capacity = 0;
                          local_3f8._0_4_ = 0xe;
                          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                                    (&local_3f0,
                                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     &linkage_name);
                          local_3d8 = 0xffffffff;
                          if (*(MatrixLayout *)
                               &(pIVar39->operands_).
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish == local_3f8._0_4_) {
                            psVar10 = (pIVar39->operands_).
                                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
                            psVar11 = (pointer)(pIVar39->inst_).words;
                            sVar58 = (long)psVar11 - (long)psVar10;
                            if ((sVar58 != (long)local_3f0.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)local_3f0.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) ||
                               ((psVar11 != psVar10 &&
                                (iVar57 = bcmp(psVar10,local_3f0.
                                                                                                              
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,sVar58),
                                iVar57 != 0)))) goto LAB_0062c428;
                            bVar70 = (pIVar39->inst_).type_id == 0xffffffff;
                          }
                          else {
LAB_0062c428:
                            bVar70 = false;
                          }
                          if (bVar70) {
LAB_0062c430:
                            bVar69 = true;
                            bVar21 = false;
                            bVar20 = false;
                          }
                          else {
                            local_418.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)0x0;
                            local_418.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            local_418.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            local_1d0 = 0xd;
                            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                                      (&local_1c8,&local_418);
                            local_1b0 = 0xffffffff;
                            if (*(int *)&(pIVar39->operands_).
                                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                         ._M_impl.super__Vector_impl_data._M_finish == local_1d0) {
                              psVar10 = (pIVar39->operands_).
                                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
                              psVar11 = (pointer)(pIVar39->inst_).words;
                              sVar58 = (long)psVar11 - (long)psVar10;
                              if ((sVar58 == (long)local_1c8.
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_1c8.
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) &&
                                 (((psVar11 == psVar10 ||
                                   (iVar57 = bcmp(psVar10,local_1c8.
                                                                                                                    
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,sVar58),
                                   iVar57 == 0)) && ((pIVar39->inst_).type_id == 0xffffffff))))
                              goto LAB_0062c430;
                            }
                            local_438.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)0x0;
                            local_438.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            local_438.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            local_1f8 = 0x11;
                            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                                      (&local_1f0,&local_438);
                            local_1d8 = 0xffffffff;
                            if (*(int *)&(pIVar39->operands_).
                                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                         ._M_impl.super__Vector_impl_data._M_finish == local_1f8) {
                              psVar10 = (pIVar39->operands_).
                                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
                              psVar11 = (pointer)(pIVar39->inst_).words;
                              sVar58 = (long)psVar11 - (long)psVar10;
                              if (((sVar58 == (long)local_1f0.
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)local_1f0.
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) &&
                                  ((psVar11 == psVar10 ||
                                   (iVar57 = bcmp(psVar10,local_1f0.
                                                                                                                    
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,sVar58),
                                   iVar57 == 0)))) && ((pIVar39->inst_).type_id == 0xffffffff)) {
                                bVar21 = true;
                                bVar20 = false;
                                bVar69 = true;
                                goto LAB_0062c5e5;
                              }
                            }
                            local_458.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)0x0;
                            local_458.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            local_458.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            local_220 = 0x10;
                            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                                      (&local_218,&local_458);
                            local_200 = 0xffffffff;
                            bVar21 = true;
                            if (*(int *)&(pIVar39->operands_).
                                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                         ._M_impl.super__Vector_impl_data._M_finish == local_220) {
                              psVar10 = (pIVar39->operands_).
                                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
                              psVar11 = (pointer)(pIVar39->inst_).words;
                              sVar58 = (long)psVar11 - (long)psVar10;
                              if ((sVar58 != (long)local_218.
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_218.
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) ||
                                 ((psVar11 != psVar10 &&
                                  (iVar57 = bcmp(psVar10,local_218.
                                                                                                                  
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,sVar58),
                                  iVar57 != 0)))) goto LAB_0062c5e1;
                              bVar69 = (pIVar39->inst_).type_id == 0xffffffff;
                            }
                            else {
LAB_0062c5e1:
                              bVar69 = false;
                            }
                            bVar20 = true;
                          }
LAB_0062c5e5:
                          if (bVar20) {
                            if (local_218.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(local_218.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              (long)local_218.
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)local_218.
                                                                                                            
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            }
                            if (local_458.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(local_458.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              (long)local_458.
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)local_458.
                                                                                                            
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            }
                          }
                          if (bVar21) {
                            if (local_1f0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(local_1f0.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              (long)local_1f0.
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)local_1f0.
                                                                                                            
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            }
                            if (local_438.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(local_438.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              (long)local_438.
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)local_438.
                                                                                                            
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            }
                          }
                          if (!bVar70) {
                            if (local_1c8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(local_1c8.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              (long)local_1c8.
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)local_1c8.
                                                                                                            
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            }
                            if (local_418.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(local_418.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              (long)local_418.
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)local_418.
                                                                                                            
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            }
                          }
                          if (local_3f0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_3f0.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_3f0.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_3f0.
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if (linkage_name._M_dataplus._M_p != (pointer)0x0) {
                            operator_delete(linkage_name._M_dataplus._M_p,
                                            linkage_name.field_2._M_allocated_capacity -
                                            (long)linkage_name._M_dataplus._M_p);
                          }
                          bVar70 = true;
                          if (bVar69) {
                            if (SVar23 == Output) {
                              if (((_Rb_tree_header *)local_508 != p_Var63) ||
                                 (1 < (psVar37->_M_t)._M_impl.super__Rb_tree_header._M_node_count))
                              {
                                ValidationState_t::diag
                                          ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID
                                           ,var_instr);
                                ValidationState_t::VkErrorID_abi_cxx11_
                                          (&linkage_name,vstate,0x1839,(char *)0x0);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                                           linkage_name._M_string_length);
                                ValidationState_t::SpvDecorationString_abi_cxx11_
                                          ((string *)&k,vstate,
                                           *(uint32_t *)
                                            &(pIVar39->operands_).
                                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                             ._M_impl.super__Vector_impl_data._M_finish);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_3f8,
                                           (char *)k.
                                                  super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>
                                           ,uStack_570);
                                lVar59 = 0x6f;
                                pcVar64 = 
                                " decorated variable must not be used in fragment execution model as an Output storage class for Entry Point id "
                                ;
                                goto LAB_0062c864;
                              }
                            }
                            else if ((SVar23 == Input) &&
                                    (((_Rb_tree_header *)local_4e0 != p_Var63 ||
                                     (1 < (psVar37->_M_t)._M_impl.super__Rb_tree_header.
                                          _M_node_count)))) {
                              ValidationState_t::diag
                                        ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,
                                         var_instr);
                              ValidationState_t::VkErrorID_abi_cxx11_
                                        (&linkage_name,vstate,0x183a,(char *)0x0);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                                         linkage_name._M_string_length);
                              ValidationState_t::SpvDecorationString_abi_cxx11_
                                        ((string *)&k,vstate,
                                         *(uint32_t *)
                                          &(pIVar39->operands_).
                                           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                           ._M_impl.super__Vector_impl_data._M_finish);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_3f8,
                                         (char *)k.
                                                 super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>
                                         ,uStack_570);
                              lVar59 = 0x6c;
                              pcVar64 = 
                              " decorated variable must not be used in vertex execution model as an Input storage class for Entry Point id "
                              ;
LAB_0062c864:
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_3f8,pcVar64,lVar59);
                              std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_3f8,".",1);
                              local_5e8 = (_Base_ptr)(ulong)(uint)local_228;
                              if (k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int> !=
                                  (_Tuple_impl<0UL,_spv::Decoration,_unsigned_int>)local_568) {
                                operator_delete((void *)k.
                                                  super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>
                                                ,(ulong)(local_568._0_8_ + 1));
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                                operator_delete(linkage_name._M_dataplus._M_p,
                                                linkage_name.field_2._M_allocated_capacity + 1);
                              }
                              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                              bVar70 = false;
                            }
                          }
                          if (!bVar70) {
                            pVVar33 = (ValidationState_t *)0x1;
                            p_Var51 = (_Base_ptr)((ulong)__h_1 & 0xffffffff);
                            goto LAB_0062c92f;
                          }
                          pIVar39 = (Instruction *)
                                    std::_Rb_tree_increment((_Rb_tree_node_base *)pIVar39);
                          p_Var51 = (_Base_ptr)
                                    CONCAT71((int7)((ulong)pIVar39 >> 8),pIVar39 == local_540);
                        } while (pIVar39 != local_540);
                        pVVar33 = (ValidationState_t *)0xa;
                      }
LAB_0062c92f:
                      if (((ulong)p_Var51 & 1) != 0) {
                        bVar70 = anon_unknown_0::hasDecoration
                                           ((anon_unknown_0 *)(ulong)(var_instr->inst_).result_id,
                                            0xe,decoration,pVVar33);
                        p_Var51 = (_Base_ptr)CONCAT71(extraout_var_01,bVar70);
                        if (bVar70) {
LAB_0062ca4b:
                          local_638 = CONCAT71((int7)((ulong)p_Var51 >> 8),local_5f8) & 0xffffffff;
                          pVVar33 = (ValidationState_t *)0x0;
                          goto LAB_0062bad8;
                        }
                        pVVar33 = (ValidationState_t *)0x0;
                        if ((SVar23 == Input) &&
                           (p_Var51 = local_508, (_Rb_tree_header *)local_508 != p_Var63)) {
                          bVar70 = ValidationState_t::IsFloatScalarType(vstate,id_00);
                          if ((!bVar70) ||
                             (uVar29 = ValidationState_t::GetBitWidth(vstate,id_00), uVar29 != 0x40)
                             ) {
                            bVar70 = ValidationState_t::IsIntScalarOrVectorType(vstate,id_00);
                            p_Var51 = (_Base_ptr)CONCAT71(extraout_var_02,bVar70);
                            if (!bVar70) goto LAB_0062ca4b;
                          }
                          ValidationState_t::diag
                                    ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,
                                     var_instr);
                          ValidationState_t::VkErrorID_abi_cxx11_
                                    (&linkage_name,vstate,0x1288,(char *)0x0);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                                     linkage_name._M_string_length);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3f8,"Fragment OpEntryPoint operand ",0x1e);
                          std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3f8,
                                     " with Input interfaces with integer or float type must have a Flat decoration for Entry Point id "
                                     ,0x61);
                          std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                          lVar59 = 1;
                          pcVar64 = ".";
                          goto LAB_0062c0bc;
                        }
                      }
                    }
                  }
                }
                else {
                  if (SVar23 == Function) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,var_instr);
                    lVar59 = 0x39;
                    pcVar64 = "OpEntryPoint interfaces should only list global variables";
                    goto LAB_0062bab7;
                  }
                  local_3f8 = (undefined1  [8])&seen_vars;
                  pVar72 = std::
                           _Hashtable<spvtools::val::Instruction*,spvtools::val::Instruction*,std::allocator<spvtools::val::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::val::Instruction*>,std::hash<spvtools::val::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                           ::
                           _M_insert<spvtools::val::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::val::Instruction*,false>>>>
                                     ((_Hashtable<spvtools::val::Instruction*,spvtools::val::Instruction*,std::allocator<spvtools::val::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::val::Instruction*>,std::hash<spvtools::val::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                       *)local_3f8,&var_instr,(DiagnosticStream *)local_3f8);
                  if (((undefined1  [16])pVar72 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                  goto LAB_0062bb1b;
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,var_instr);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,"Non-unique OpEntryPoint interface ",0x22);
                  ValidationState_t::getIdName_abi_cxx11_(&linkage_name,vstate,id);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                             linkage_name._M_string_length);
                  lVar59 = 0xe;
                  pcVar64 = " is disallowed";
LAB_0062c0bc:
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,pcVar64,lVar59);
                  local_5e8 = (_Base_ptr)(ulong)(uint)local_228;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                    operator_delete(linkage_name._M_dataplus._M_p,
                                    linkage_name.field_2._M_allocated_capacity + 1);
                  }
LAB_0062bac4:
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                  pVVar33 = (ValidationState_t *)0x1;
                  p_Var51 = extraout_RAX;
                }
                local_638 = CONCAT71((int7)((ulong)p_Var51 >> 8),local_5f8) & 0xffffffff;
              }
LAB_0062bad8:
              uVar26 = (uint)pVVar33;
              if (uVar26 != 0) goto LAB_0062cb43;
            }
            uVar26 = 6;
LAB_0062cb43:
            pEVar67 = local_4d0;
            iVar57 = (int)local_4f8;
            if (uVar26 == 6) {
              if (((int)local_5cc < 2) && ((int)local_4f8 < 2)) {
                local_3f8._0_4_ = MVar27;
                pmVar38 = std::
                          map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                          ::operator[]((map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                                        *)__h,(key_type_conflict *)local_3f8);
                p_Var40 = (__hashtable *)
                          (pmVar38->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                p_Var61 = (__hashtable *)&(pmVar38->_M_t)._M_impl.super__Rb_tree_header;
                bVar70 = p_Var40 == p_Var61;
                p_Var19 = p_Var61;
                p_Var18 = __h_1;
                while (__h_1 = p_Var19, uVar26 = 0xc, !bVar70) {
                  fVar52 = (p_Var40->_M_rehash_policy)._M_max_load_factor;
                  if (fVar52 == 5.74532e-44) {
                    uVar65 = (ulong)local_540 >> 0x20;
                    local_540 = (Instruction *)CONCAT44((int)uVar65,0x29);
                    p_Var60 = (__node_base_ptr)(p_Var40->_M_rehash_policy)._M_next_resize;
                    p_Var12 = p_Var40->_M_single_bucket;
                    linkage_name._M_dataplus._M_p = (pointer)&linkage_name.field_2;
                    linkage_name._M_string_length = 0;
                    linkage_name.field_2._M_allocated_capacity =
                         linkage_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                    bVar20 = p_Var60 == p_Var12;
                    if (bVar20) {
                      bVar21 = false;
                    }
                    else {
                      bVar21 = false;
                      do {
                        uVar26 = *(uint *)&p_Var60->_M_nxt;
                        bVar62 = 0;
                        bVar69 = false;
                        uVar65 = 0;
                        do {
                          if ((char)(uVar26 >> (bVar62 & 0x1f)) == '\0') {
                            bVar21 = true;
                            break;
                          }
                          std::__cxx11::string::push_back((char)&linkage_name);
                          bVar69 = 2 < uVar65;
                          uVar65 = uVar65 + 1;
                          bVar62 = bVar62 + 8;
                        } while (uVar65 != 4);
                        if (!bVar69) break;
                        p_Var60 = (__node_base_ptr)((long)&p_Var60->_M_nxt + 4);
                        bVar20 = p_Var60 == p_Var12;
                      } while (!bVar20);
                    }
                    pEVar67 = local_4d0;
                    if (bVar20) {
                      __assert_fail("!assert_found_terminating_null && \"Did not find terminating null for the string.\""
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/string_utils.h"
                                    ,0x65,
                                    "std::string spvtools::utils::MakeString(InputIt, InputIt, bool) [InputIt = __gnu_cxx::__normal_iterator<const unsigned int *, std::vector<unsigned int>>]"
                                   );
                    }
                    iVar57 = (int)local_4f8;
                    if ((!bVar21) &&
                       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)linkage_name._M_dataplus._M_p != &linkage_name.field_2)) {
                      operator_delete(linkage_name._M_dataplus._M_p,
                                      linkage_name.field_2._M_allocated_capacity + 1);
                    }
                    pIVar39 = ValidationState_t::FindDef(vstate,MVar27);
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_BINARY,pIVar39
                              );
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,
                               "The LinkageAttributes Decoration (Linkage name: ",0x30);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                               linkage_name._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,") cannot be applied to function id ",0x23);
                    std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,
                               " because it is targeted by an OpEntryPoint instruction.",0x37);
                    local_5e8 = (_Base_ptr)(ulong)(uint)local_228;
                    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                      operator_delete(linkage_name._M_dataplus._M_p,
                                      linkage_name.field_2._M_allocated_capacity + 1);
                    }
                    p_Var61 = __h_1;
                    fVar52 = (float)local_540;
                  }
                  if (fVar52 == 5.74532e-44) {
                    uVar26 = 1;
                    p_Var18 = __h_1;
                    break;
                  }
                  p_Var40 = (__hashtable *)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var40);
                  p_Var19 = __h_1;
                  p_Var18 = __h_1;
                  bVar70 = p_Var40 == p_Var61;
                }
                __h_1 = p_Var18;
                if (!bVar70) goto LAB_0062ced5;
                bVar70 = EnumSet<spv::Capability>::contains
                                   (local_4e8,CapabilityWorkgroupMemoryExplicitLayoutKHR);
                if ((((bVar70) &&
                     (bVar20 = EnumSet<spv::Capability>::contains
                                         (local_4e8,CapabilityUntypedPointersKHR), !bVar20)) &&
                    (0 < local_52c)) && (0 < local_57c)) {
                  if (local_52c == local_57c) {
                    uVar26 = 0;
                    if ((local_57c < 2) || (local_57c == local_4ec)) goto LAB_0062ced5;
                    pIVar39 = ValidationState_t::FindDef(vstate,MVar27);
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_BINARY,pIVar39
                              );
                    lVar59 = 0x120;
                    pcVar64 = 
                    "When declaring WorkgroupMemoryExplicitLayoutKHR, if more than one Workgroup Storage Class variable in the entry point interface point to a type decorated with Block, all of them must be decorated with Aliased (unless the UntypedPointerWorkgroupKHR capability is declared). Entry point id "
                    ;
                  }
                  else {
                    pIVar39 = ValidationState_t::FindDef(vstate,MVar27);
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_BINARY,pIVar39
                              );
                    lVar59 = 0x102;
                    pcVar64 = 
                    "When declaring WorkgroupMemoryExplicitLayoutKHR, either all or none of the Workgroup Storage Class variables in the entry point interface must point to struct types decorated with Block (unless the UntypedPointersKHR capability is declared).  Entry point id "
                    ;
                  }
                  goto LAB_0062cdd8;
                }
                uVar26 = 0;
                if (bVar70 || local_57c < 1) goto LAB_0062ced5;
                pIVar39 = ValidationState_t::FindDef(vstate,MVar27);
                ValidationState_t::diag
                          ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_BINARY,pIVar39);
                lVar59 = 0x81;
                pcVar64 = 
                "Workgroup Storage Class variables can\'t be decorated with Block unless declaring the WorkgroupMemoryExplicitLayoutKHR capability."
                ;
              }
              else {
                pIVar39 = ValidationState_t::FindDef(vstate,MVar27);
                ValidationState_t::diag
                          ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_BINARY,pIVar39);
                lVar59 = 0xa9;
                pcVar64 = 
                "There must be at most one object per Storage Class that can contain a structure type containing members decorated with BuiltIn, consumed per entry-point. Entry Point id "
                ;
LAB_0062cdd8:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3f8,pcVar64,lVar59);
                std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                lVar59 = 0x20;
                pcVar64 = " does not meet this requirement.";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3f8,pcVar64,lVar59);
              local_5e8 = (_Base_ptr)(ulong)(uint)local_228;
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
              uVar26 = 1;
            }
LAB_0062ced5:
            in_RCX = (ValidationState_t *)(ulong)uVar26;
            std::
            _Hashtable<spv::BuiltIn,_spv::BuiltIn,_std::allocator<spv::BuiltIn>,_std::__detail::_Identity,_std::equal_to<spv::BuiltIn>,_std::hash<spv::BuiltIn>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable(&output_var_builtin._M_h);
            std::
            _Hashtable<spv::BuiltIn,_spv::BuiltIn,_std::allocator<spv::BuiltIn>,_std::__detail::_Identity,_std::equal_to<spv::BuiltIn>,_std::hash<spv::BuiltIn>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable(&input_var_builtin._M_h);
            std::
            _Hashtable<spvtools::val::Instruction_*,_spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::val::Instruction_*>,_std::hash<spvtools::val::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable(&seen_vars._M_h);
            if (uVar26 != 0) goto LAB_0062cf8e;
            pEVar67 = pEVar67 + 1;
          } while (pEVar67 != local_500);
          in_RCX = (ValidationState_t *)0x4;
        }
LAB_0062cf8e:
        if ((int)in_RCX != 4) {
          local_61c = (spv_result_t)local_5e8;
          if ((int)in_RCX == 2) {
            local_61c = SPV_SUCCESS;
          }
          goto LAB_0062cfb3;
        }
        pMVar42 = pMVar42 + 1;
      } while (pMVar42 != local_460);
    }
    local_61c = SPV_SUCCESS;
LAB_0062cfb3:
    if (local_61c == SPV_SUCCESS) {
      seen_vars._M_h._M_buckets = &seen_vars._M_h._M_single_bucket;
      seen_vars._M_h._M_bucket_count = 1;
      seen_vars._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      seen_vars._M_h._M_element_count = 0;
      seen_vars._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      seen_vars._M_h._M_rehash_policy._M_next_resize = 0;
      seen_vars._M_h._M_single_bucket = (__node_base_ptr)0x0;
      pIVar66 = (vstate->ordered_instructions_).
                super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pIVar13 = (vstate->ordered_instructions_).
                super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pIVar66 != pIVar13) {
        local_508 = (_Base_ptr)&vstate->module_capabilities_;
        local_4e0 = (_Base_ptr)&vstate->id_decorations_;
        __h = &(vstate->pointer_to_uniform_block_)._M_h;
        __h_1 = &(vstate->struct_for_uniform_block_)._M_h;
        __h_2 = &(vstate->pointer_to_storage_buffer_)._M_h;
        do {
          pIVar39 = ValidationState_t::FindDef(vstate,(pIVar66->inst_).type_id);
          input_var_builtin._M_h._M_buckets = &input_var_builtin._M_h._M_single_bucket;
          input_var_builtin._M_h._M_bucket_count = 1;
          input_var_builtin._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          input_var_builtin._M_h._M_element_count = 0;
          input_var_builtin._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          input_var_builtin._M_h._M_rehash_policy._M_next_resize = 0;
          input_var_builtin._M_h._M_single_bucket = (__node_base_ptr)0x0;
          uVar3 = (pIVar66->inst_).opcode;
          if ((uVar3 == 0x1142) || (uVar3 == 0x3b)) {
            uVar26 = (pIVar66->inst_).result_id;
            this = (anon_unknown_0 *)(ulong)uVar26;
            uVar6 = (pIVar66->words_).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[3];
            bVar70 = spvIsVulkanEnv(vstate->context_->target_env);
            if (bVar70) {
              if (uVar6 == 9) {
                ValidationState_t::EntryPointReferences
                          ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&output_var_builtin,vstate,uVar26);
                bVar70 = (size_type *)output_var_builtin._M_h._M_element_count ==
                         &output_var_builtin._M_h._M_bucket_count;
                p_Var41 = (_Rb_tree_node_base *)output_var_builtin._M_h._M_element_count;
                while (cVar71 = '\0', !bVar70) {
                  uVar65 = (ulong)_ep_id >> 0x20;
                  _ep_id = (char *)CONCAT44((int)uVar65,p_Var41[1]._M_color);
                  local_3f8 = (undefined1  [8])&seen_vars;
                  std::
                  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  ::
                  _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                            (local_3f8,
                             (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                              *)&ep_id,(DiagnosticStream *)local_3f8);
                  if ((extraout_EDX & 1) == 0) {
                    pIVar39 = ValidationState_t::FindDef(vstate,uVar26);
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar39);
                    in_RCX = (ValidationState_t *)0x0;
                    ValidationState_t::VkErrorID_abi_cxx11_(&linkage_name,vstate,0x1a12,(char *)0x0)
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                               linkage_name._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,"Entry point id \'",0x10);
                    std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,
                               "\' uses more than one PushConstant interface.\n",0x2d);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,"From Vulkan spec:\n",0x12);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,
                               "There must be no more than one push constant block ",0x33);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,"statically used per shader entry point.",0x27);
                    local_638 = (ulong)(uint)local_228;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                      operator_delete(linkage_name._M_dataplus._M_p,
                                      linkage_name.field_2._M_allocated_capacity + 1);
                    }
                    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                  }
                  if ((extraout_EDX & 1) == 0) {
                    cVar71 = '\x01';
                    break;
                  }
                  p_Var41 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var41);
                  bVar70 = p_Var41 == (_Rb_tree_node_base *)&output_var_builtin._M_h._M_bucket_count
                  ;
                }
                std::
                _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&output_var_builtin,
                           (_Link_type)output_var_builtin._M_h._M_before_begin._M_nxt);
                if (bVar70) goto LAB_0062d539;
              }
              else {
LAB_0062d539:
                if (uVar6 != 0) goto LAB_0062d71d;
                ValidationState_t::EntryPointReferences
                          ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&output_var_builtin,vstate,uVar26);
                if ((output_var_builtin._M_h._M_rehash_policy._M_next_resize == 0) ||
                   (bVar70 = anon_unknown_0::hasDecoration(this,0x22,decoration,in_RCX), bVar70)) {
                  bVar70 = true;
                  if ((output_var_builtin._M_h._M_rehash_policy._M_next_resize != 0) &&
                     (bVar20 = anon_unknown_0::hasDecoration(this,0x21,decoration,in_RCX), !bVar20))
                  {
                    pIVar39 = ValidationState_t::FindDef(vstate,uVar26);
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar39);
                    in_RCX = (ValidationState_t *)0x0;
                    ValidationState_t::VkErrorID_abi_cxx11_(&linkage_name,vstate,0x1a15,(char *)0x0)
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                               linkage_name._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,"UniformConstant id \'",0x14);
                    std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                    lVar59 = 0x21;
                    pcVar64 = "\' is missing Binding decoration.\n";
                    goto LAB_0062d699;
                  }
                }
                else {
                  pIVar39 = ValidationState_t::FindDef(vstate,uVar26);
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar39);
                  in_RCX = (ValidationState_t *)0x0;
                  ValidationState_t::VkErrorID_abi_cxx11_(&linkage_name,vstate,0x1a15,(char *)0x0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                             linkage_name._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,"UniformConstant id \'",0x14);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                  lVar59 = 0x27;
                  pcVar64 = "\' is missing DescriptorSet decoration.\n";
LAB_0062d699:
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,pcVar64,lVar59);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,"From Vulkan spec:\n",0x12);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,
                             "These variables must have DescriptorSet and Binding decorations specified"
                             ,0x49);
                  local_638 = (ulong)(uint)local_228;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                    operator_delete(linkage_name._M_dataplus._M_p,
                                    linkage_name.field_2._M_allocated_capacity + 1);
                  }
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                  bVar70 = false;
                }
                std::
                _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&output_var_builtin,
                           (_Link_type)output_var_builtin._M_h._M_before_begin._M_nxt);
                cVar71 = '\x01';
                if (bVar70) goto LAB_0062d71d;
              }
            }
            else {
LAB_0062d71d:
              bVar70 = spvIsOpenGLEnv(vstate->context_->target_env);
              if (bVar70) {
                bVar70 = anon_unknown_0::hasDecoration(this,2,decoration,in_RCX);
                bVar20 = anon_unknown_0::hasDecoration(this,3,decoration,in_RCX);
                if ((uVar6 == 0xc && bVar70) || (bVar21 = true, uVar6 == 2 && (bVar70 || bVar20))) {
                  ValidationState_t::EntryPointReferences
                            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)&output_var_builtin,vstate,uVar26);
                  bVar21 = true;
                  if ((output_var_builtin._M_h._M_rehash_policy._M_next_resize != 0) &&
                     (bVar70 = anon_unknown_0::hasDecoration(this,0x21,decoration,in_RCX), !bVar70))
                  {
                    pIVar39 = ValidationState_t::FindDef(vstate,uVar26);
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar39);
                    pcVar64 = "Storage Buffer";
                    in_RCX = (ValidationState_t *)0x8ea5c0;
                    if (uVar6 == 2) {
                      pcVar64 = "Uniform";
                    }
                    linkage_name._M_dataplus._M_p = pcVar64;
                    pDVar44 = DiagnosticStream::operator<<
                                        ((DiagnosticStream *)local_3f8,(char **)&linkage_name);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar44," id \'",5);
                    std::ostream::_M_insert<unsigned_long>((ulong)pDVar44);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar44,"\' is missing Binding decoration.\n",0x21);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar44,"From ARB_gl_spirv extension:\n",0x1d);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar44,"Uniform and shader storage block variables must "
                               ,0x30);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar44,"also be decorated with a *Binding*.",0x23);
                    local_638 = (ulong)(uint)pDVar44->error_;
                    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                    bVar21 = false;
                  }
                  std::
                  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)&output_var_builtin,
                             (_Link_type)output_var_builtin._M_h._M_before_begin._M_nxt);
                }
                cVar71 = '\x01';
                if (!bVar21) goto LAB_0062e42f;
              }
              if (uVar6 == 4) {
                bVar70 = EnumSet<spv::Capability>::contains
                                   ((EnumSet<spv::Capability> *)local_508,
                                    CapabilityWorkgroupMemoryExplicitLayoutKHR);
              }
              else {
                bVar70 = false;
              }
              if ((bVar70 != false) ||
                 (((uVar6 < 0xd && ((0x1204U >> (uVar6 & 0x1f) & 1) != 0)) ||
                  (cVar71 = '\0', uVar6 == 0x14e5)))) {
                pIVar39 = ValidationState_t::FindDef
                                    (vstate,(pIVar66->words_).
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start[1]);
                uVar5 = (pIVar39->inst_).opcode;
                if ((uVar5 != 0x20) && (uVar5 != 0x1141)) {
                  __assert_fail("spv::Op::OpTypePointer == ptrInst->opcode() || spv::Op::OpTypeUntypedPointerKHR == ptrInst->opcode()"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_decorations.cpp"
                                ,0x4c5,
                                "spv_result_t spvtools::val::(anonymous namespace)::CheckDecorationsOfBuffers(ValidationState_t &)"
                               );
                }
                if (uVar3 == 0x1142) {
                  puVar14 = (pIVar66->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  in_RCX = (ValidationState_t *)
                           ((long)(pIVar66->words_).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar14);
                  MVar27 = kRowMajor;
                  if ((ValidationState_t *)0x10 < in_RCX) {
                    pMVar42 = puVar14 + 4;
                    goto LAB_0062d97f;
                  }
                }
                else {
                  pMVar42 = (pIVar39->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start + 3;
LAB_0062d97f:
                  MVar27 = *pMVar42;
                }
                if (MVar27 != kRowMajor) {
                  pIVar43 = ValidationState_t::FindDef(vstate,MVar27);
                  if ((bVar70 == false) &&
                     (uVar53 = (pIVar43->inst_).opcode & 0xfffffffe,
                     in_RCX = (ValidationState_t *)(ulong)uVar53, (short)uVar53 == 0x1c)) {
                    MVar27 = Instruction::GetOperandAs<unsigned_int>(pIVar43,1);
                    pIVar43 = ValidationState_t::FindDef(vstate,MVar27);
                  }
                  cVar71 = '\x03';
                  if ((pIVar43->inst_).opcode != 0x1e) goto LAB_0062e42f;
                  local_3f8._0_4_ = kColumnMajor;
                  local_3f8._4_4_ = 0;
                  anon_unknown_0::ComputeMemberConstraintsForStruct
                            ((MemberConstraints *)&input_var_builtin,MVar27,
                             (LayoutConstraints *)local_3f8,vstate);
                }
                _ep_id = "ConstantDataStorageBuffer";
                if (bVar70 != false) {
                  _ep_id = "Function or Workgroup";
                }
                _ep_id = _ep_id + 0xc;
                if (uVar6 == 9) {
                  _ep_id = "PushConstant";
                }
                in_RCX = (ValidationState_t *)0x8ea5c0;
                if (uVar6 == 2) {
                  _ep_id = "Uniform";
                }
                bVar20 = spvIsVulkanEnv(vstate->context_->target_env);
                if (bVar20) {
                  bVar20 = anon_unknown_0::hasDecoration
                                     ((anon_unknown_0 *)(ulong)MVar27,2,decoration,in_RCX);
                  bVar21 = anon_unknown_0::hasDecoration
                                     ((anon_unknown_0 *)(ulong)MVar27,3,decoration,in_RCX);
                  if ((uVar6 != 0xc) || (!bVar21)) {
                    if (uVar6 == 9 && !bVar20) {
                      pIVar43 = ValidationState_t::FindDef(vstate,MVar27);
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar43);
                      in_RCX = (ValidationState_t *)0x0;
                      ValidationState_t::VkErrorID_abi_cxx11_
                                ((string *)&output_var_builtin,vstate,0x1a13,(char *)0x0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3f8,(char *)output_var_builtin._M_h._M_buckets,
                                 output_var_builtin._M_h._M_bucket_count);
                      lVar59 = 0x11;
                      pcVar64 = "PushConstant id \'";
LAB_0062dd4b:
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3f8,pcVar64,lVar59);
                      std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3f8,"\' is missing Block decoration.\n",0x1f);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3f8,"From Vulkan spec:\n",0x12);
                      lVar59 = 0x39;
                      pcVar64 = "Such variables must be identified with a Block decoration";
                      goto LAB_0062dd92;
                    }
                    if (uVar6 == 0xc && !bVar20) {
                      pIVar43 = ValidationState_t::FindDef(vstate,MVar27);
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar43);
                      in_RCX = (ValidationState_t *)0x0;
                      ValidationState_t::VkErrorID_abi_cxx11_
                                ((string *)&output_var_builtin,vstate,0x1a13,(char *)0x0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3f8,(char *)output_var_builtin._M_h._M_buckets,
                                 output_var_builtin._M_h._M_bucket_count);
                      lVar59 = 0x12;
                      pcVar64 = "StorageBuffer id \'";
                      goto LAB_0062dd4b;
                    }
                    in_RCX = (ValidationState_t *)CONCAT71((int7)((ulong)in_RCX >> 8),uVar6 != 2);
                    if ((!bVar20 && !bVar21) && uVar6 == 2) {
                      pIVar43 = ValidationState_t::FindDef(vstate,MVar27);
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar43);
                      in_RCX = (ValidationState_t *)0x0;
                      ValidationState_t::VkErrorID_abi_cxx11_
                                ((string *)&output_var_builtin,vstate,0x1a14,(char *)0x0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3f8,(char *)output_var_builtin._M_h._M_buckets,
                                 output_var_builtin._M_h._M_bucket_count);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3f8,"Uniform id \'",0xc);
                      std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3f8,
                                 "\' is missing Block or BufferBlock decoration.\n",0x2e);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3f8,"From Vulkan spec:\n",0x12);
                      lVar59 = 0x48;
                      pcVar64 = 
                      "Such variables must be identified with a Block or BufferBlock decoration";
                      goto LAB_0062dd92;
                    }
                    if ((uVar6 == 0xc) || (bVar20 = true, uVar6 == 2)) {
                      ValidationState_t::EntryPointReferences
                                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                  *)&output_var_builtin,vstate,uVar26);
                      if ((output_var_builtin._M_h._M_rehash_policy._M_next_resize == 0) ||
                         (bVar20 = anon_unknown_0::hasDecoration(this,0x22,decoration,in_RCX),
                         bVar20)) {
                        bVar20 = true;
                        if ((output_var_builtin._M_h._M_rehash_policy._M_next_resize != 0) &&
                           (bVar21 = anon_unknown_0::hasDecoration(this,0x21,decoration,in_RCX),
                           !bVar21)) {
                          pIVar43 = ValidationState_t::FindDef(vstate,uVar26);
                          ValidationState_t::diag
                                    ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,
                                     pIVar43);
                          in_RCX = (ValidationState_t *)0x0;
                          ValidationState_t::VkErrorID_abi_cxx11_
                                    (&linkage_name,vstate,0x1a15,(char *)0x0);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                                     linkage_name._M_string_length);
                          pDVar44 = DiagnosticStream::operator<<
                                              ((DiagnosticStream *)local_3f8,(char **)&ep_id);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)pDVar44," id \'",5);
                          std::ostream::_M_insert<unsigned_long>((ulong)pDVar44);
                          lVar59 = 0x21;
                          pcVar64 = "\' is missing Binding decoration.\n";
                          goto LAB_0062e6d0;
                        }
                      }
                      else {
                        pIVar43 = ValidationState_t::FindDef(vstate,uVar26);
                        ValidationState_t::diag
                                  ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar43
                                  );
                        in_RCX = (ValidationState_t *)0x0;
                        ValidationState_t::VkErrorID_abi_cxx11_
                                  (&linkage_name,vstate,0x1a15,(char *)0x0);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                                   linkage_name._M_string_length);
                        pDVar44 = DiagnosticStream::operator<<
                                            ((DiagnosticStream *)local_3f8,(char **)&ep_id);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)pDVar44," id \'",5);
                        std::ostream::_M_insert<unsigned_long>((ulong)pDVar44);
                        lVar59 = 0x27;
                        pcVar64 = "\' is missing DescriptorSet decoration.\n";
LAB_0062e6d0:
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)pDVar44,pcVar64,lVar59);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)pDVar44,"From Vulkan spec:\n",0x12);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)pDVar44,
                                   "These variables must have DescriptorSet and Binding decorations specified"
                                   ,0x49);
                        local_638 = (ulong)(uint)pDVar44->error_;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                          operator_delete(linkage_name._M_dataplus._M_p,
                                          linkage_name.field_2._M_allocated_capacity + 1);
                        }
                        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                        bVar20 = false;
                      }
                      std::
                      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                  *)&output_var_builtin,
                                 (_Link_type)output_var_builtin._M_h._M_before_begin._M_nxt);
                    }
                  }
                  else {
                    pIVar43 = ValidationState_t::FindDef(vstate,uVar26);
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar43);
                    in_RCX = (ValidationState_t *)0x0;
                    ValidationState_t::VkErrorID_abi_cxx11_
                              ((string *)&output_var_builtin,vstate,0x1a13,(char *)0x0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,(char *)output_var_builtin._M_h._M_buckets,
                               output_var_builtin._M_h._M_bucket_count);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,"Storage buffer id \'",0x13);
                    std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                    lVar59 = 0x55;
                    pcVar64 = 
                    " In Vulkan, BufferBlock is disallowed on variables in the StorageBuffer storage class"
                    ;
LAB_0062dd92:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,pcVar64,lVar59);
                    local_638 = (ulong)(uint)local_228;
                    if ((__node_base *)output_var_builtin._M_h._M_buckets !=
                        &output_var_builtin._M_h._M_before_begin) {
                      operator_delete(output_var_builtin._M_h._M_buckets,
                                      (ulong)((long)&(output_var_builtin._M_h._M_before_begin._M_nxt
                                                     )->_M_nxt + 1));
                    }
                    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                    bVar20 = false;
                  }
                  cVar71 = '\x01';
                  if (!bVar20) goto LAB_0062e42f;
                }
                cVar71 = '\0';
                if (MVar27 != kRowMajor) {
                  local_3f8._0_4_ = MVar27;
                  pmVar38 = std::
                            map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                            ::operator[]((map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                                          *)local_4e0,(key_type_conflict *)local_3f8);
                  in_RCX = (ValidationState_t *)
                           (pmVar38->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                  local_4f8 = (ValidationState_t *)&(pmVar38->_M_t)._M_impl.super__Rb_tree_header;
                  cVar71 = '\0';
                  if (in_RCX != local_4f8) {
                    local_4d0 = (pointer)CONCAT71(local_4d0._1_7_,uVar6 == 0xc || uVar6 == 0x14e5);
                    local_540 = (Instruction *)((ulong)bVar70 | 0x28);
                    local_500 = (pointer)(ulong)MVar27;
                    do {
                      bVar21 = uVar6 == 2;
                      iVar57 = in_RCX->generator_;
                      bVar69 = iVar57 == 2;
                      bVar20 = true;
                      if ((((iVar57 != 3 || !bVar21) && (bVar20 = bVar69, bVar70 == false)) &&
                          (uVar6 != 9)) && ((uVar6 != 0x14e5 && (uVar6 != 0xc)))) {
                        bVar20 = false;
                      }
                      pVVar33 = in_RCX;
                      if (bVar21 && bVar69) {
                        output_var_builtin._M_h._M_buckets =
                             (__buckets_ptr)
                             CONCAT44(output_var_builtin._M_h._M_buckets._4_4_,
                                      (pIVar39->inst_).result_id);
                        local_3f8 = (undefined1  [8])__h;
                        std::
                        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        ::
                        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                                  (__h,(_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                        *)&output_var_builtin,local_3f8);
                        output_var_builtin._M_h._M_buckets =
                             (__buckets_ptr)
                             CONCAT44(output_var_builtin._M_h._M_buckets._4_4_,MVar27);
                        local_3f8 = (undefined1  [8])__h_1;
                        std::
                        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        ::
                        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                                  (__h_1,(_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                          *)&output_var_builtin,local_3f8);
                      }
                      if ((byte)((iVar57 == 3 && bVar21) | iVar57 == 2 & (byte)local_4d0) == 1) {
                        output_var_builtin._M_h._M_buckets =
                             (__buckets_ptr)
                             CONCAT44(output_var_builtin._M_h._M_buckets._4_4_,
                                      (pIVar39->inst_).result_id);
                        local_3f8 = (undefined1  [8])__h_2;
                        std::
                        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        ::
                        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                                  (__h_2,(_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                          *)&output_var_builtin,local_3f8);
                        output_var_builtin._M_h._M_buckets =
                             (__buckets_ptr)
                             CONCAT44(output_var_builtin._M_h._M_buckets._4_4_,MVar27);
                        local_3f8 = (undefined1  [8])&vstate->struct_for_storage_buffer_;
                        std::
                        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        ::
                        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                                  (&vstate->struct_for_storage_buffer_,
                                   (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                    *)&output_var_builtin,local_3f8);
                      }
                      bVar2 = true;
                      if ((bool)((bVar21 && bVar69) | bVar20)) {
                        pcVar64 = "BufferBlock";
                        if (iVar57 == 2) {
                          pcVar64 = "Block";
                        }
                        bVar2 = *(bool *)((long)&(vstate->options_->universal_limits_).
                                                 max_struct_members +
                                         (long)&(local_540->words_).
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         );
                        output_var_builtin._M_h._M_buckets = (__buckets_ptr)pcVar64;
                        bVar22 = anon_unknown_0::isMissingOffsetInStruct(MVar27,vstate);
                        if (bVar22) {
                          pVVar33 = (ValidationState_t *)ValidationState_t::FindDef(vstate,MVar27);
                          ValidationState_t::diag
                                    ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,
                                     (Instruction *)pVVar33);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3f8,"Structure id ",0xd);
                          std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3f8," decorated as ",0xe);
                          pDVar44 = DiagnosticStream::operator<<
                                              ((DiagnosticStream *)local_3f8,
                                               (char **)&output_var_builtin);
                          lVar59 = 0x35;
                          pcVar64 = " must be explicitly laid out with Offset decorations.";
                        }
                        else {
                          k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                          super__Tuple_impl<1UL,_unsigned_int>.
                          super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                               (_Head_base<1UL,_unsigned_int,_false>)0x0;
                          k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                          super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl =
                               DecorationRelaxedPrecision;
                          local_568._8_8_ =
                               std::
                               _Function_handler<bool_(spv::Decoration),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_decorations.cpp:1343:23)>
                               ::_M_invoke;
                          local_568._0_8_ =
                               std::
                               _Function_handler<bool_(spv::Decoration),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_decorations.cpp:1343:23)>
                               ::_M_manager;
                          bVar22 = anon_unknown_0::checkForRequiredDecoration
                                             (MVar27,(function<bool_(spv::Decoration)> *)&k,
                                              OpTypeArray,vstate);
                          if ((code *)local_568._0_8_ != (code *)0x0) {
                            (*(code *)local_568._0_8_)
                                      ((function<bool_(spv::Decoration)> *)&k,
                                       (function<bool_(spv::Decoration)> *)&k,3);
                          }
                          if (bVar22) {
                            var_instr = (Instruction *)0x0;
                            _uStack_520 = 0;
                            local_510 = std::
                                        _Function_handler<bool_(spv::Decoration),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_decorations.cpp:1355:23)>
                                        ::_M_invoke;
                            local_518 = std::
                                        _Function_handler<bool_(spv::Decoration),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_decorations.cpp:1355:23)>
                                        ::_M_manager;
                            bVar22 = anon_unknown_0::checkForRequiredDecoration
                                               (MVar27,(function<bool_(spv::Decoration)> *)
                                                       &var_instr,OpTypeMatrix,vstate);
                            if (local_518 != (code *)0x0) {
                              (*local_518)((_Any_data *)&var_instr,(_Any_data *)&var_instr,
                                           __destroy_functor);
                            }
                            if (bVar22) {
                              _builtin = (void *)0x0;
                              uStack_480 = 0;
                              local_470 = std::
                                          _Function_handler<bool_(spv::Decoration),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_decorations.cpp:1367:23)>
                                          ::_M_invoke;
                              local_478 = std::
                                          _Function_handler<bool_(spv::Decoration),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_decorations.cpp:1367:23)>
                                          ::_M_manager;
                              pVVar33 = vstate;
                              bVar22 = anon_unknown_0::checkForRequiredDecoration
                                                 (MVar27,(function<bool_(spv::Decoration)> *)
                                                         &builtin,OpTypeMatrix,vstate);
                              if (local_478 != (code *)0x0) {
                                (*local_478)((_Any_data *)&builtin,(_Any_data *)&builtin,
                                             __destroy_functor);
                              }
                              if (bVar22) {
                                bVar22 = spvIsVulkanEnv(vstate->context_->target_env);
                                if (bVar22) {
                                  if (bVar21 && bVar69) {
                                    pVVar33 = (ValidationState_t *)0x1;
                                    sVar28 = anon_unknown_0::checkLayout
                                                       (MVar27,_ep_id,
                                                        (char *)output_var_builtin._M_h._M_buckets,
                                                        true,bVar2,0,
                                                        (MemberConstraints *)&input_var_builtin,
                                                        vstate);
                                    if (sVar28 == SPV_SUCCESS) goto LAB_0062e205;
LAB_0062e24a:
                                    bVar2 = false;
                                    local_638 = (ulong)(uint)sVar28;
                                    goto LAB_0062e3f5;
                                  }
LAB_0062e205:
                                  if (bVar20) {
                                    pVVar33 = (ValidationState_t *)0x0;
                                    sVar28 = anon_unknown_0::checkLayout
                                                       (MVar27,_ep_id,
                                                        (char *)output_var_builtin._M_h._M_buckets,
                                                        false,bVar2,0,
                                                        (MemberConstraints *)&input_var_builtin,
                                                        vstate);
                                    if (sVar28 != SPV_SUCCESS) goto LAB_0062e24a;
                                  }
                                }
                                bVar2 = true;
                                goto LAB_0062e3f5;
                              }
                              pVVar33 = (ValidationState_t *)
                                        ValidationState_t::FindDef(vstate,MVar27);
                              ValidationState_t::diag
                                        ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,
                                         (Instruction *)pVVar33);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_3f8,"Structure id ",0xd);
                              std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_3f8," decorated as ",0xe);
                              pDVar44 = DiagnosticStream::operator<<
                                                  ((DiagnosticStream *)local_3f8,
                                                   (char **)&output_var_builtin);
                              lVar59 = 0x43;
                              pcVar64 = 
                              " must be explicitly laid out with RowMajor or ColMajor decorations.";
                            }
                            else {
                              pVVar33 = (ValidationState_t *)
                                        ValidationState_t::FindDef(vstate,MVar27);
                              ValidationState_t::diag
                                        ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,
                                         (Instruction *)pVVar33);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_3f8,"Structure id ",0xd);
                              std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_3f8," decorated as ",0xe);
                              pDVar44 = DiagnosticStream::operator<<
                                                  ((DiagnosticStream *)local_3f8,
                                                   (char **)&output_var_builtin);
                              lVar59 = 0x3b;
                              pcVar64 = 
                              " must be explicitly laid out with MatrixStride decorations.";
                            }
                          }
                          else {
                            pVVar33 = (ValidationState_t *)ValidationState_t::FindDef(vstate,MVar27)
                            ;
                            ValidationState_t::diag
                                      ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,
                                       (Instruction *)pVVar33);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_3f8,"Structure id ",0xd);
                            std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_3f8," decorated as ",0xe);
                            pDVar44 = DiagnosticStream::operator<<
                                                ((DiagnosticStream *)local_3f8,
                                                 (char **)&output_var_builtin);
                            lVar59 = 0x3a;
                            pcVar64 = " must be explicitly laid out with ArrayStride decorations.";
                          }
                        }
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)pDVar44,pcVar64,lVar59);
                        local_638 = (ulong)(uint)pDVar44->error_;
                        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                        bVar2 = false;
                      }
LAB_0062e3f5:
                      if (!bVar2) {
                        in_RCX = pVVar33;
                        cVar71 = '\x01';
                        break;
                      }
                      in_RCX = (ValidationState_t *)
                               std::_Rb_tree_increment((_Rb_tree_node_base *)in_RCX);
                    } while (in_RCX != local_4f8);
                  }
                }
              }
            }
LAB_0062e42f:
            _Var17._M_nxt = input_var_builtin._M_h._M_before_begin._M_nxt;
            if (cVar71 == '\0') goto LAB_0062e43c;
          }
          else {
            if (((pIVar39 == (Instruction *)0x0) || ((pIVar39->inst_).opcode != 0x20)) ||
               (SVar23 = Instruction::GetOperandAs<spv::StorageClass>(pIVar39,1),
               SVar23 != PhysicalStorageBuffer)) {
              bVar70 = EnumSet<spv::Capability>::contains
                                 ((EnumSet<spv::Capability> *)local_508,CapabilityUntypedPointersKHR
                                 );
              if ((bVar70) && (bVar70 = spvIsVulkanEnv(vstate->context_->target_env), bVar70)) {
                uVar4 = (pIVar66->inst_).opcode;
                uVar26 = uVar4 - 0x1143;
                if (uVar26 < 7) {
                  if ((0x33U >> (uVar26 & 0x1f) & 1) == 0) {
                    if (uVar26 != 6) goto LAB_0062e4f0;
                    uVar26 = Instruction::GetOperandAs<unsigned_int>(pIVar66,3);
                    pIVar39 = ValidationState_t::FindDef(vstate,uVar26);
                    uVar29 = (pIVar39->inst_).type_id;
                  }
                  else {
                    uVar29 = (pIVar66->inst_).type_id;
                  }
                  uVar26 = Instruction::GetOperandAs<unsigned_int>(pIVar66,2);
LAB_0062d3ae:
                  in_RCX = (ValidationState_t *)(ulong)uVar26;
                }
                else {
LAB_0062e4f0:
                  in_RCX = (ValidationState_t *)0x0;
                  if (uVar4 == 0x3d) {
                    uVar29 = ValidationState_t::GetOperandTypeId(vstate,pIVar66,2);
                    OVar30 = ValidationState_t::GetIdOpcode(vstate,uVar29);
                    in_RCX = (ValidationState_t *)0x0;
                    uVar29 = 0;
                    if (OVar30 == OpTypeUntypedPointerKHR) {
                      uVar26 = Instruction::GetOperandAs<unsigned_int>(pIVar66,2);
                      pIVar39 = ValidationState_t::FindDef(vstate,uVar26);
                      uVar29 = (pIVar39->inst_).type_id;
                      in_RCX = (ValidationState_t *)(ulong)(pIVar66->inst_).type_id;
                    }
                  }
                  else {
                    uVar29 = 0;
                    if (uVar4 == 0x3e) {
                      uVar29 = ValidationState_t::GetOperandTypeId(vstate,pIVar66,0);
                      OVar30 = ValidationState_t::GetIdOpcode(vstate,uVar29);
                      in_RCX = (ValidationState_t *)0x0;
                      uVar29 = 0;
                      if (OVar30 == OpTypeUntypedPointerKHR) {
                        uVar26 = Instruction::GetOperandAs<unsigned_int>(pIVar66,0);
                        pIVar39 = ValidationState_t::FindDef(vstate,uVar26);
                        uVar29 = (pIVar39->inst_).type_id;
                        uVar26 = ValidationState_t::GetOperandTypeId(vstate,pIVar66,1);
                        goto LAB_0062d3ae;
                      }
                    }
                  }
                }
                cVar71 = '\x03';
                if (((uint32_t)in_RCX != 0) && (uVar29 != 0)) {
                  pIVar39 = ValidationState_t::FindDef(vstate,uVar29);
                  SVar23 = Instruction::GetOperandAs<spv::StorageClass>(pIVar39,1);
                  pcVar64 = "Uniform";
                  bVar70 = SVar23 != StorageClassUniform;
                  if ((bVar70) &&
                     ((pcVar64 = "PushConstant", SVar23 != PushConstant &&
                      (pcVar64 = "StorageBuffer", SVar23 == StorageClassWorkgroup)))) {
                    pcVar64 = "Workgroup";
                  }
                  pIVar39 = ValidationState_t::FindDef(vstate,(uint32_t)in_RCX);
                  bVar20 = (&vstate->options_->scalar_block_layout)[SVar23 == StorageClassWorkgroup]
                  ;
                  if (((pIVar39->inst_).opcode & 0xfffe) == 0x1c) {
                    uVar26 = Instruction::GetOperandAs<unsigned_int>(pIVar39,1);
                    pIVar43 = ValidationState_t::FindDef(vstate,uVar26);
                    if (((pIVar43->inst_).opcode == 0x1e) &&
                       ((bVar21 = ValidationState_t::HasDecoration
                                            (vstate,(pIVar43->inst_).result_id,Block), bVar21 ||
                        (bVar21 = ValidationState_t::HasDecoration
                                            (vstate,(pIVar43->inst_).result_id,BufferBlock), bVar21)
                        ))) {
                      in_RCX = (ValidationState_t *)(ulong)(pIVar43->inst_).result_id;
                      pIVar39 = pIVar43;
                    }
                  }
                  uVar29 = (uint32_t)in_RCX;
                  if ((pIVar39->inst_).opcode == 0x1e) {
                    if (SVar23 == StorageClassUniform) {
                      bVar70 = ValidationState_t::HasDecoration(vstate,uVar29,BufferBlock);
                    }
                    local_3f8._0_4_ = kColumnMajor;
                    local_3f8._4_4_ = 0;
                    anon_unknown_0::ComputeMemberConstraintsForStruct
                              ((MemberConstraints *)&input_var_builtin,uVar29,
                               (LayoutConstraints *)local_3f8,vstate);
                  }
                  decoration_str = "BufferBlock";
                  if (SVar23 != StorageClassUniform) {
                    decoration_str = "Block";
                  }
                  if (bVar70 == false) {
                    decoration_str = "Block";
                  }
                  sVar28 = anon_unknown_0::checkLayout
                                     (uVar29,pcVar64,decoration_str,(bool)(bVar70 ^ 1),bVar20,0,
                                      (MemberConstraints *)&input_var_builtin,vstate);
                  cVar71 = sVar28 != SPV_SUCCESS;
                  if ((bool)cVar71) {
                    local_638._0_4_ = sVar28;
                  }
                  in_RCX = (ValidationState_t *)(ulong)(uint)(spv_result_t)local_638;
                  local_638 = (ulong)(uint)(spv_result_t)local_638;
                }
                _Var17._M_nxt = input_var_builtin._M_h._M_before_begin._M_nxt;
                if (cVar71 != '\0') goto joined_r0x0062e449;
              }
            }
            else {
              uVar26 = Instruction::GetOperandAs<unsigned_int>(pIVar39,2);
              pIVar39 = ValidationState_t::FindDef(vstate,uVar26);
              bVar70 = vstate->options_->scalar_block_layout;
              if ((pIVar39->inst_).opcode == 0x1e) {
                local_3f8._0_4_ = kColumnMajor;
                local_3f8._4_4_ = 0;
                anon_unknown_0::ComputeMemberConstraintsForStruct
                          ((MemberConstraints *)&input_var_builtin,uVar26,
                           (LayoutConstraints *)local_3f8,vstate);
              }
              sVar28 = anon_unknown_0::checkLayout
                                 (uVar26,"PhysicalStorageBuffer","Block",false,bVar70,0,
                                  (MemberConstraints *)&input_var_builtin,vstate);
              cVar71 = '\x01';
              if (sVar28 != SPV_SUCCESS) {
                local_638._0_4_ = sVar28;
              }
              in_RCX = (ValidationState_t *)(ulong)(uint)(spv_result_t)local_638;
              local_638 = (ulong)(uint)(spv_result_t)local_638;
              _Var17 = input_var_builtin._M_h._M_before_begin;
              if (sVar28 != SPV_SUCCESS) goto joined_r0x0062e449;
            }
LAB_0062e43c:
            cVar71 = '\0';
            _Var17._M_nxt = input_var_builtin._M_h._M_before_begin._M_nxt;
          }
joined_r0x0062e449:
          while (_Var17._M_nxt != (_Hash_node_base *)0x0) {
            p_Var15 = (_Var17._M_nxt)->_M_nxt;
            operator_delete(_Var17._M_nxt,0x20);
            _Var17._M_nxt = p_Var15;
          }
          memset(input_var_builtin._M_h._M_buckets,0,input_var_builtin._M_h._M_bucket_count << 3);
          input_var_builtin._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          input_var_builtin._M_h._M_element_count = 0;
          if (&input_var_builtin._M_h._M_single_bucket != input_var_builtin._M_h._M_buckets) {
            operator_delete(input_var_builtin._M_h._M_buckets,
                            input_var_builtin._M_h._M_bucket_count << 3);
          }
          if ((cVar71 != '\x03') && (cVar71 != '\0')) {
            goto LAB_0062e74a;
          }
          pIVar66 = pIVar66 + 1;
        } while (pIVar66 != pIVar13);
      }
      local_638._0_4_ = SPV_SUCCESS;
LAB_0062e74a:
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&seen_vars);
      local_61c = (spv_result_t)local_638;
      if ((spv_result_t)local_638 == SPV_SUCCESS) {
        seen_vars._M_h._M_element_count = (size_type)&seen_vars._M_h._M_bucket_count;
        sVar28 = SPV_SUCCESS;
        seen_vars._M_h._M_bucket_count = seen_vars._M_h._M_bucket_count & 0xffffffff00000000;
        seen_vars._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        seen_vars._M_h._M_rehash_policy._M_next_resize = 0;
        input_var_builtin._M_h._M_element_count = (size_type)&input_var_builtin._M_h._M_bucket_count
        ;
        input_var_builtin._M_h._M_bucket_count =
             input_var_builtin._M_h._M_bucket_count & 0xffffffff00000000;
        input_var_builtin._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        input_var_builtin._M_h._M_rehash_policy._M_next_resize = 0;
        pIVar66 = (vstate->ordered_instructions_).
                  super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pIVar13 = (vstate->ordered_instructions_).
                  super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        input_var_builtin._M_h._M_rehash_policy._0_8_ = input_var_builtin._M_h._M_element_count;
        seen_vars._M_h._M_rehash_policy._0_8_ = seen_vars._M_h._M_element_count;
        if (pIVar66 != pIVar13) {
          do {
            uVar3 = (pIVar66->inst_).opcode;
            if (uVar3 == 0x48) {
              puVar14 = (pIVar66->words_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              id_01._M_head_impl = puVar14[1];
              _Var7._M_head_impl =
                   ((_Head_base<1UL,_unsigned_int,_false> *)(puVar14 + 2))->_M_head_impl;
              uVar29 = puVar14[3];
              k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
              super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl = id_01._M_head_impl;
              k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
              super__Tuple_impl<1UL,_unsigned_int>.super__Head_base<1UL,_unsigned_int,_false>.
              _M_head_impl = (_Head_base<1UL,_unsigned_int,_false>)
                             (_Head_base<1UL,_unsigned_int,_false>)_Var7._M_head_impl;
              pVar75 = std::
                       _Rb_tree<std::tuple<spv::Decoration,unsigned_int,unsigned_int>,std::tuple<spv::Decoration,unsigned_int,unsigned_int>,std::_Identity<std::tuple<spv::Decoration,unsigned_int,unsigned_int>>,std::less<std::tuple<spv::Decoration,unsigned_int,unsigned_int>>,std::allocator<std::tuple<spv::Decoration,unsigned_int,unsigned_int>>>
                       ::
                       _M_insert_unique<std::tuple<spv::Decoration,unsigned_int,unsigned_int>const&>
                                 ((_Rb_tree<std::tuple<spv::Decoration,unsigned_int,unsigned_int>,std::tuple<spv::Decoration,unsigned_int,unsigned_int>,std::_Identity<std::tuple<spv::Decoration,unsigned_int,unsigned_int>>,std::less<std::tuple<spv::Decoration,unsigned_int,unsigned_int>>,std::allocator<std::tuple<spv::Decoration,unsigned_int,unsigned_int>>>
                                   *)&input_var_builtin,
                                  (tuple<spv::Decoration,_unsigned_int,_unsigned_int> *)&k);
              if ((((undefined1  [16])pVar75 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (uVar29 != 0x1603)) {
                pIVar39 = ValidationState_t::FindDef(vstate,id_01._M_head_impl);
                ValidationState_t::diag
                          ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar39);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,"ID \'",4);
                std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3f8,"\', member \'",0xb);
                std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3f8,"\' decorated with ",0x11);
                ValidationState_t::SpvDecorationString_abi_cxx11_
                          ((string *)&output_var_builtin,vstate,uVar29);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3f8,(char *)output_var_builtin._M_h._M_buckets,
                           output_var_builtin._M_h._M_bucket_count);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3f8," multiple times is not allowed.",0x1f);
                sVar28 = local_228;
                if ((__node_base *)output_var_builtin._M_h._M_buckets !=
                    &output_var_builtin._M_h._M_before_begin) {
                  operator_delete(output_var_builtin._M_h._M_buckets,
                                  (ulong)((long)&(output_var_builtin._M_h._M_before_begin._M_nxt)->
                                                 _M_nxt + 1));
                }
                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                iVar57 = 1;
                goto LAB_0062ed87;
              }
              if (uVar29 == 4) {
                uVar31 = 5;
LAB_0062eb25:
                var_instr = (Instruction *)CONCAT44(id_01._M_head_impl,_Var7._M_head_impl);
                uStack_520 = uVar31;
                iVar46 = std::
                         _Rb_tree<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>_>
                         ::find((_Rb_tree<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>_>
                                 *)&input_var_builtin,(key_type *)&var_instr);
                if (iVar46._M_node == (_Base_ptr)&input_var_builtin._M_h._M_bucket_count) {
                  iVar57 = 0;
                }
                else {
                  pIVar39 = ValidationState_t::FindDef(vstate,id_01._M_head_impl);
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar39);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,"ID \'",4)
                  ;
                  std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,"\', member \'",0xb);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,"\' decorated with both ",0x16);
                  ValidationState_t::SpvDecorationString_abi_cxx11_
                            ((string *)&output_var_builtin,vstate,uVar29);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,(char *)output_var_builtin._M_h._M_buckets,
                             output_var_builtin._M_h._M_bucket_count);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8," and ",5)
                  ;
                  ValidationState_t::SpvDecorationString_abi_cxx11_(&linkage_name,vstate,uVar31);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                             linkage_name._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8," is not allowed.",0x10);
                  sVar28 = local_228;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                    operator_delete(linkage_name._M_dataplus._M_p,
                                    linkage_name.field_2._M_allocated_capacity + 1);
                  }
                  if ((__node_base *)output_var_builtin._M_h._M_buckets !=
                      &output_var_builtin._M_h._M_before_begin) {
                    operator_delete(output_var_builtin._M_h._M_buckets,
                                    (ulong)((long)&(output_var_builtin._M_h._M_before_begin._M_nxt)
                                                   ->_M_nxt + 1));
                  }
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                  iVar57 = 1;
                }
              }
              else {
                iVar57 = 9;
                if (uVar29 == 5) {
                  uVar31 = 4;
                  goto LAB_0062eb25;
                }
              }
              if ((iVar57 == 9) || (iVar57 == 0)) {
                iVar57 = 7;
              }
              if (iVar57 == 7) {
                iVar57 = 0;
              }
LAB_0062ed87:
              if (iVar57 == 0) goto LAB_0062ed8b;
            }
            else {
              if (uVar3 == 0x47) {
                puVar14 = (pIVar66->words_).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                p_Var1 = (_Tuple_impl<0UL,_spv::Decoration,_unsigned_int> *)(puVar14 + 1);
                uVar29 = (p_Var1->super__Tuple_impl<1UL,_unsigned_int>).
                         super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                uVar31 = puVar14[2];
                k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int> = *p_Var1;
                pVar74 = std::
                         _Rb_tree<std::tuple<spv::Decoration,unsigned_int>,std::tuple<spv::Decoration,unsigned_int>,std::_Identity<std::tuple<spv::Decoration,unsigned_int>>,std::less<std::tuple<spv::Decoration,unsigned_int>>,std::allocator<std::tuple<spv::Decoration,unsigned_int>>>
                         ::_M_insert_unique<std::tuple<spv::Decoration,unsigned_int>const&>
                                   ((_Rb_tree<std::tuple<spv::Decoration,unsigned_int>,std::tuple<spv::Decoration,unsigned_int>,std::_Identity<std::tuple<spv::Decoration,unsigned_int>>,std::less<std::tuple<spv::Decoration,unsigned_int>>,std::allocator<std::tuple<spv::Decoration,unsigned_int>>>
                                     *)&seen_vars,&k);
                if (((((undefined1  [16])pVar74 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                    && (uVar31 != 0x26)) && (uVar31 != 0x1603)) {
                  pIVar39 = ValidationState_t::FindDef(vstate,uVar29);
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar39);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,"ID \'",4)
                  ;
                  std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,"\' decorated with ",0x11);
                  ValidationState_t::SpvDecorationString_abi_cxx11_
                            ((string *)&output_var_builtin,vstate,uVar31);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,(char *)output_var_builtin._M_h._M_buckets,
                             output_var_builtin._M_h._M_bucket_count);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8," multiple times is not allowed.",0x1f);
                  sVar28 = local_228;
                  if ((__node_base *)output_var_builtin._M_h._M_buckets !=
                      &output_var_builtin._M_h._M_before_begin) {
                    operator_delete(output_var_builtin._M_h._M_buckets,
                                    (ulong)((long)&(output_var_builtin._M_h._M_before_begin._M_nxt)
                                                   ->_M_nxt + 1));
                  }
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                  iVar57 = 1;
                }
                else {
                  lVar59 = 0;
                  do {
                    decoration_00 = (&DAT_008fdb84)[lVar59 * 2];
                    if (((&(anonymous_namespace)::
                           CheckDecorationsCompatibility(spvtools::val::ValidationState_t&)::
                           mutually_exclusive_per_id)[lVar59 * 2] == uVar31) ||
                       (iVar57 = 6, bVar70 = decoration_00 == uVar31,
                       decoration_00 =
                            (&(anonymous_namespace)::
                              CheckDecorationsCompatibility(spvtools::val::ValidationState_t&)::
                              mutually_exclusive_per_id)[lVar59 * 2], bVar70)) {
                      var_instr = (Instruction *)CONCAT44(decoration_00,uVar29);
                      iVar45 = std::
                               _Rb_tree<std::tuple<spv::Decoration,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int>_>_>
                               ::find((_Rb_tree<std::tuple<spv::Decoration,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int>_>_>
                                       *)&seen_vars,(key_type *)&var_instr);
                      if (iVar45._M_node == (_Base_ptr)&seen_vars._M_h._M_bucket_count) {
                        iVar57 = 0;
                      }
                      else {
                        pIVar39 = ValidationState_t::FindDef(vstate,uVar29);
                        ValidationState_t::diag
                                  ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar39
                                  );
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3f8,"ID \'",4);
                        std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3f8,"\' decorated with both ",0x16);
                        ValidationState_t::SpvDecorationString_abi_cxx11_
                                  ((string *)&output_var_builtin,vstate,uVar31);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3f8,(char *)output_var_builtin._M_h._M_buckets,
                                   output_var_builtin._M_h._M_bucket_count);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3f8," and ",5);
                        ValidationState_t::SpvDecorationString_abi_cxx11_
                                  (&linkage_name,vstate,decoration_00);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                                   linkage_name._M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3f8," is not allowed.",0x10);
                        sVar28 = local_228;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                          operator_delete(linkage_name._M_dataplus._M_p,
                                          linkage_name.field_2._M_allocated_capacity + 1);
                        }
                        if ((__node_base *)output_var_builtin._M_h._M_buckets !=
                            &output_var_builtin._M_h._M_before_begin) {
                          operator_delete(output_var_builtin._M_h._M_buckets,
                                          (ulong)((long)&(output_var_builtin._M_h._M_before_begin.
                                                         _M_nxt)->_M_nxt + 1));
                        }
                        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                        iVar57 = 1;
                      }
                    }
                    if ((iVar57 != 6) && (iVar57 != 0)) goto LAB_0062e9b6;
                    lVar59 = lVar59 + 1;
                  } while (lVar59 != 3);
                  iVar57 = 4;
LAB_0062e9b6:
                  if (iVar57 == 4) {
                    iVar57 = 0;
                  }
                }
                goto LAB_0062ed87;
              }
LAB_0062ed8b:
              iVar57 = 0;
            }
            if (iVar57 != 0) goto LAB_0062eda8;
            pIVar66 = pIVar66 + 1;
          } while (pIVar66 != pIVar13);
          iVar57 = 2;
LAB_0062eda8:
          if (iVar57 == 2) {
            sVar28 = SPV_SUCCESS;
          }
        }
        std::
        _Rb_tree<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>_>
        ::_M_erase((_Rb_tree<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>_>
                    *)&input_var_builtin,(_Link_type)input_var_builtin._M_h._M_before_begin._M_nxt);
        std::
        _Rb_tree<std::tuple<spv::Decoration,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int>_>_>
        ::_M_erase((_Rb_tree<std::tuple<spv::Decoration,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int>_>_>
                    *)&seen_vars,(_Link_type)seen_vars._M_h._M_before_begin._M_nxt);
        local_61c = sVar28;
        if (sVar28 == SPV_SUCCESS) {
          pvVar47 = ValidationState_t::functions(vstate);
          this_00 = (pvVar47->
                    super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pFVar16 = (pvVar47->
                    super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          local_61c = SPV_SUCCESS;
          if (this_00 != pFVar16) {
            do {
              sVar48 = Function::block_count(this_00);
              bVar20 = anon_unknown_0::hasImportLinkageAttribute(this_00->id_,vstate);
              bVar70 = true;
              if (sVar48 == 0) {
                if (!bVar20) {
                  pIVar39 = ValidationState_t::FindDef(vstate,this_00->id_);
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_BINARY,pIVar39);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,"Function declaration (id ",0x19);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                  lVar59 = 0x48;
                  pcVar64 = 
                  ") must have a LinkageAttributes decoration with the Import Linkage type.";
                  goto LAB_0062eed9;
                }
              }
              else if (bVar20) {
                pIVar39 = ValidationState_t::FindDef(vstate,this_00->id_);
                ValidationState_t::diag
                          ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_BINARY,pIVar39);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3f8,"Function definition (id ",0x18);
                std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                lVar59 = 0x30;
                pcVar64 = ") may not be decorated with Import Linkage type.";
LAB_0062eed9:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3f8,pcVar64,lVar59);
                sVar28 = local_228;
                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                bVar70 = false;
              }
              local_61c = sVar28;
            } while ((bVar70) &&
                    (this_00 = this_00 + 1, local_61c = SPV_SUCCESS, this_00 != pFVar16));
          }
          if (local_61c == SPV_SUCCESS) {
            MVar32 = ValidationState_t::memory_model(vstate);
            local_61c = SPV_SUCCESS;
            if (MVar32 == MemoryModelVulkan) {
              input_var_builtin._M_h._M_buckets = &input_var_builtin._M_h._M_before_begin._M_nxt;
              input_var_builtin._M_h._M_bucket_count = 0;
              input_var_builtin._M_h._M_before_begin._M_nxt =
                   input_var_builtin._M_h._M_before_begin._M_nxt & 0xffffffffffffff00;
              std::__cxx11::ostringstream::ostringstream
                        ((ostringstream *)&seen_vars,(string *)&input_var_builtin,_S_out);
              p_Var49 = &(vstate->all_definitions_)._M_h._M_before_begin;
              do {
                p_Var49 = p_Var49->_M_nxt;
                if (p_Var49 == (__node_base *)0x0) {
                  local_61c = SPV_SUCCESS;
                  break;
                }
                pIVar39 = *(Instruction **)
                           &((_Prime_rehash_policy *)(p_Var49 + 2))->_M_max_load_factor;
                MVar27 = (pIVar39->inst_).result_id;
                local_3f8._0_4_ = MVar27;
                pmVar38 = std::
                          map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                          ::operator[](&vstate->id_decorations_,(key_type_conflict *)local_3f8);
                for (p_Var51 = (pmVar38->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                    bVar70 = (_Rb_tree_header *)p_Var51 ==
                             &(pmVar38->_M_t)._M_impl.super__Rb_tree_header, !bVar70;
                    p_Var51 = (_Base_ptr)std::_Rb_tree_increment(p_Var51)) {
                  if ((p_Var51[1]._M_color | 2) == 0x17) {
                    pcVar64 = "Coherent";
                    if (p_Var51[1]._M_color != 0x17) {
                      pcVar64 = "Volatile";
                    }
                    _Var8 = p_Var51[2]._M_color;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&seen_vars,pcVar64,8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&seen_vars," decoration targeting ",0x16);
                    ValidationState_t::getIdName_abi_cxx11_((string *)local_3f8,vstate,MVar27);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&seen_vars,(char *)local_3f8,
                               (long)local_3f0.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                    if (local_3f8 !=
                        (undefined1  [8])
                        &local_3f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish) {
                      operator_delete((void *)local_3f8,
                                      (long)local_3f0.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_finish + 1);
                    }
                    if (_Var8 != ~_S_red) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&seen_vars," (member index ",0xf);
                      poVar50 = (ostream *)
                                std::ostream::operator<<((ostringstream *)&seen_vars,_Var8);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar50,")",1);
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&seen_vars,
                               " is banned when using the Vulkan memory model.",0x2e);
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar39);
                    std::__cxx11::stringbuf::str();
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,(char *)output_var_builtin._M_h._M_buckets,
                               output_var_builtin._M_h._M_bucket_count);
                    local_61c = local_228;
                    if ((__node_base *)output_var_builtin._M_h._M_buckets !=
                        &output_var_builtin._M_h._M_before_begin) {
                      operator_delete(output_var_builtin._M_h._M_buckets,
                                      (ulong)((long)&(output_var_builtin._M_h._M_before_begin._M_nxt
                                                     )->_M_nxt + 1));
                    }
                    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                    bVar20 = false;
                  }
                  else {
                    bVar20 = true;
                  }
                  if (!bVar20) break;
                }
              } while (bVar70);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&seen_vars);
              std::ios_base::~ios_base(local_138);
              if ((__node_base *)input_var_builtin._M_h._M_buckets !=
                  &input_var_builtin._M_h._M_before_begin) {
                operator_delete(input_var_builtin._M_h._M_buckets,
                                (ulong)((long)&(input_var_builtin._M_h._M_before_begin._M_nxt)->
                                               _M_nxt + 1));
              }
            }
            if (local_61c == SPV_SUCCESS) {
              local_61c = anon_unknown_0::CheckDecorationsFromDecoration(vstate);
            }
          }
        }
      }
    }
  }
  return local_61c;
}

Assistant:

spv_result_t ValidateDecorations(ValidationState_t& vstate) {
  if (auto error = CheckImportedVariableInitialization(vstate)) return error;
  if (auto error = CheckDecorationsOfEntryPoints(vstate)) return error;
  if (auto error = CheckDecorationsOfBuffers(vstate)) return error;
  if (auto error = CheckDecorationsCompatibility(vstate)) return error;
  if (auto error = CheckLinkageAttrOfFunctions(vstate)) return error;
  if (auto error = CheckVulkanMemoryModelDeprecatedDecorations(vstate))
    return error;
  if (auto error = CheckDecorationsFromDecoration(vstate)) return error;
  return SPV_SUCCESS;
}